

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  int iVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  ulong uVar62;
  long lVar63;
  long lVar64;
  Geometry *geometry;
  long lVar65;
  bool bVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 auVar69 [8];
  long lVar70;
  undefined8 unaff_R13;
  ulong uVar71;
  byte bVar72;
  float fVar73;
  float fVar121;
  float fVar123;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar82 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar74;
  undefined1 auVar83 [16];
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined4 uVar127;
  float fVar135;
  float fVar136;
  vint4 bi_2;
  undefined1 auVar128 [16];
  float fVar137;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  vint4 bi_1;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  float fVar148;
  vint4 ai_2;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar166;
  float fVar169;
  float fVar170;
  vint4 ai_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  uint uVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_890;
  undefined1 local_860 [32];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  LinearSpace3fa *local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  undefined1 local_640 [64];
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  int local_53c;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar62 = (ulong)(byte)prim[1];
  fVar148 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar81 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  auVar149._0_4_ = fVar148 * auVar81._0_4_;
  auVar149._4_4_ = fVar148 * auVar81._4_4_;
  auVar149._8_4_ = fVar148 * auVar81._8_4_;
  auVar149._12_4_ = fVar148 * auVar81._12_4_;
  auVar128._0_4_ = fVar148 * auVar80._0_4_;
  auVar128._4_4_ = fVar148 * auVar80._4_4_;
  auVar128._8_4_ = fVar148 * auVar80._8_4_;
  auVar128._12_4_ = fVar148 * auVar80._12_4_;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xc + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xd + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x12 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x13 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x14 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar181._4_4_ = auVar128._0_4_;
  auVar181._0_4_ = auVar128._0_4_;
  auVar181._8_4_ = auVar128._0_4_;
  auVar181._12_4_ = auVar128._0_4_;
  auVar28 = vshufps_avx(auVar128,auVar128,0x55);
  auVar78 = vshufps_avx(auVar128,auVar128,0xaa);
  fVar148 = auVar78._0_4_;
  auVar156._0_4_ = fVar148 * auVar75._0_4_;
  fVar135 = auVar78._4_4_;
  auVar156._4_4_ = fVar135 * auVar75._4_4_;
  fVar136 = auVar78._8_4_;
  auVar156._8_4_ = fVar136 * auVar75._8_4_;
  fVar137 = auVar78._12_4_;
  auVar156._12_4_ = fVar137 * auVar75._12_4_;
  auVar138._0_4_ = auVar76._0_4_ * fVar148;
  auVar138._4_4_ = auVar76._4_4_ * fVar135;
  auVar138._8_4_ = auVar76._8_4_ * fVar136;
  auVar138._12_4_ = auVar76._12_4_ * fVar137;
  auVar83._0_4_ = auVar77._0_4_ * fVar148;
  auVar83._4_4_ = auVar77._4_4_ * fVar135;
  auVar83._8_4_ = auVar77._8_4_ * fVar136;
  auVar83._12_4_ = auVar77._12_4_ * fVar137;
  auVar78 = vfmadd231ps_fma(auVar156,auVar28,auVar80);
  auVar82 = vfmadd231ps_fma(auVar138,auVar28,auVar25);
  auVar28 = vfmadd231ps_fma(auVar83,auVar27,auVar28);
  auVar79 = vfmadd231ps_fma(auVar78,auVar181,auVar81);
  auVar82 = vfmadd231ps_fma(auVar82,auVar181,auVar24);
  auVar128 = vfmadd231ps_fma(auVar28,auVar26,auVar181);
  auVar182._4_4_ = auVar149._0_4_;
  auVar182._0_4_ = auVar149._0_4_;
  auVar182._8_4_ = auVar149._0_4_;
  auVar182._12_4_ = auVar149._0_4_;
  auVar28 = vshufps_avx(auVar149,auVar149,0x55);
  auVar78 = vshufps_avx(auVar149,auVar149,0xaa);
  auVar75 = vmulps_avx512vl(auVar78,auVar75);
  auVar150._0_4_ = auVar78._0_4_ * auVar76._0_4_;
  auVar150._4_4_ = auVar78._4_4_ * auVar76._4_4_;
  auVar150._8_4_ = auVar78._8_4_ * auVar76._8_4_;
  auVar150._12_4_ = auVar78._12_4_ * auVar76._12_4_;
  auVar142._0_4_ = auVar78._0_4_ * auVar77._0_4_;
  auVar142._4_4_ = auVar78._4_4_ * auVar77._4_4_;
  auVar142._8_4_ = auVar78._8_4_ * auVar77._8_4_;
  auVar142._12_4_ = auVar78._12_4_ * auVar77._12_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar75,auVar28,auVar80);
  auVar80 = vfmadd231ps_fma(auVar150,auVar28,auVar25);
  auVar75 = vfmadd231ps_fma(auVar142,auVar28,auVar27);
  auVar77 = vfmadd231ps_avx512vl(auVar76,auVar182,auVar81);
  auVar25 = vfmadd231ps_fma(auVar80,auVar182,auVar24);
  auVar27 = vfmadd231ps_fma(auVar75,auVar182,auVar26);
  auVar173._8_4_ = 0x7fffffff;
  auVar173._0_8_ = 0x7fffffff7fffffff;
  auVar173._12_4_ = 0x7fffffff;
  auVar162._8_4_ = 0x219392ef;
  auVar162._0_8_ = 0x219392ef219392ef;
  auVar162._12_4_ = 0x219392ef;
  auVar81 = vandps_avx(auVar79,auVar173);
  uVar71 = vcmpps_avx512vl(auVar81,auVar162,1);
  bVar66 = (bool)((byte)uVar71 & 1);
  auVar78._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar79._0_4_;
  bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar79._4_4_;
  bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar79._8_4_;
  bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar79._12_4_;
  auVar81 = vandps_avx(auVar82,auVar173);
  uVar71 = vcmpps_avx512vl(auVar81,auVar162,1);
  bVar66 = (bool)((byte)uVar71 & 1);
  auVar79._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar82._0_4_;
  bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar82._4_4_;
  bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar82._8_4_;
  bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar82._12_4_;
  auVar81 = vandps_avx(auVar128,auVar173);
  uVar71 = vcmpps_avx512vl(auVar81,auVar162,1);
  bVar66 = (bool)((byte)uVar71 & 1);
  auVar82._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar128._0_4_;
  bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar128._4_4_;
  bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar128._8_4_;
  bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar128._12_4_;
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar167._8_4_ = 0x3f800000;
  auVar167._0_8_ = 0x3f8000003f800000;
  auVar167._12_4_ = 0x3f800000;
  auVar81 = vfnmadd213ps_fma(auVar78,auVar80,auVar167);
  auVar75 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar79);
  auVar81 = vfnmadd213ps_fma(auVar79,auVar80,auVar167);
  auVar76 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar82);
  auVar81 = vfnmadd213ps_fma(auVar82,auVar80,auVar167);
  auVar26 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx512vl(auVar81,auVar77);
  auVar163._0_4_ = auVar75._0_4_ * auVar81._0_4_;
  auVar163._4_4_ = auVar75._4_4_ * auVar81._4_4_;
  auVar163._8_4_ = auVar75._8_4_ * auVar81._8_4_;
  auVar163._12_4_ = auVar75._12_4_ * auVar81._12_4_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar80);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx512vl(auVar81,auVar77);
  auVar157._0_4_ = auVar75._0_4_ * auVar81._0_4_;
  auVar157._4_4_ = auVar75._4_4_ * auVar81._4_4_;
  auVar157._8_4_ = auVar75._8_4_ * auVar81._8_4_;
  auVar157._12_4_ = auVar75._12_4_ * auVar81._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar62 * 0xe + 6);
  auVar81 = vpmovsxwd_avx(auVar75);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar25);
  auVar168._0_4_ = auVar76._0_4_ * auVar81._0_4_;
  auVar168._4_4_ = auVar76._4_4_ * auVar81._4_4_;
  auVar168._8_4_ = auVar76._8_4_ * auVar81._8_4_;
  auVar168._12_4_ = auVar76._12_4_ * auVar81._12_4_;
  auVar75 = vpbroadcastd_avx512vl();
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar81 = vpmovsxwd_avx(auVar24);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vsubps_avx(auVar81,auVar25);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar62 * 0x15 + 6);
  auVar81 = vpmovsxwd_avx(auVar25);
  auVar139._0_4_ = auVar76._0_4_ * auVar80._0_4_;
  auVar139._4_4_ = auVar76._4_4_ * auVar80._4_4_;
  auVar139._8_4_ = auVar76._8_4_ * auVar80._8_4_;
  auVar139._12_4_ = auVar76._12_4_ * auVar80._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar27);
  auVar151._0_4_ = auVar26._0_4_ * auVar81._0_4_;
  auVar151._4_4_ = auVar26._4_4_ * auVar81._4_4_;
  auVar151._8_4_ = auVar26._8_4_ * auVar81._8_4_;
  auVar151._12_4_ = auVar26._12_4_ * auVar81._12_4_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar81 = vpmovsxwd_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar27);
  auVar129._0_4_ = auVar26._0_4_ * auVar81._0_4_;
  auVar129._4_4_ = auVar26._4_4_ * auVar81._4_4_;
  auVar129._8_4_ = auVar26._8_4_ * auVar81._8_4_;
  auVar129._12_4_ = auVar26._12_4_ * auVar81._12_4_;
  auVar81 = vpminsd_avx(auVar163,auVar157);
  auVar80 = vpminsd_avx(auVar168,auVar139);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar80 = vpminsd_avx(auVar151,auVar129);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar26._4_4_ = uVar127;
  auVar26._0_4_ = uVar127;
  auVar26._8_4_ = uVar127;
  auVar26._12_4_ = uVar127;
  auVar80 = vmaxps_avx512vl(auVar80,auVar26);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar27._8_4_ = 0x3f7ffffa;
  auVar27._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar27._12_4_ = 0x3f7ffffa;
  local_5b0 = vmulps_avx512vl(auVar81,auVar27);
  auVar81 = vpmaxsd_avx(auVar163,auVar157);
  auVar80 = vpmaxsd_avx(auVar168,auVar139);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar80 = vpmaxsd_avx(auVar151,auVar129);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar77._4_4_ = uVar127;
  auVar77._0_4_ = uVar127;
  auVar77._8_4_ = uVar127;
  auVar77._12_4_ = uVar127;
  auVar80 = vminps_avx512vl(auVar80,auVar77);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar28._8_4_ = 0x3f800003;
  auVar28._0_8_ = 0x3f8000033f800003;
  auVar28._12_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar28);
  uVar29 = vcmpps_avx512vl(local_5b0,auVar81,2);
  uVar30 = vpcmpgtd_avx512vl(auVar75,_DAT_01f4ad30);
  uVar71 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar29 & 0xf & (byte)uVar30));
  local_748 = pre->ray_space + k;
  auVar134 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_340 = vmovdqa64_avx512f(auVar134);
  for (; uVar71 != 0; uVar71 = (ulong)((uint)uVar71 & (uint)uVar71 + 0xf & (uint)uVar29)) {
    lVar65 = 0;
    for (uVar62 = uVar71; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      lVar65 = lVar65 + 1;
    }
    uVar5 = *(uint *)(prim + 2);
    pGVar7 = (context->scene->geometries).items[uVar5].ptr;
    uVar62 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                             (ulong)*(uint *)(prim + lVar65 * 4 + 6) *
                             pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    lVar63 = (long)pGVar7[1].intersectionFilterN * uVar62;
    lVar65 = *(long *)&pGVar7[1].time_range.upper;
    local_820 = *(undefined1 (*) [16])(lVar65 + lVar63);
    lVar64 = (long)pGVar7[1].intersectionFilterN * (uVar62 + 1);
    _local_690 = *(undefined1 (*) [16])(lVar65 + lVar64);
    iVar6 = (int)pGVar7[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                            0x1c);
    auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar143._8_4_ = 0xbeaaaaab;
    auVar143._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar143._12_4_ = 0xbeaaaaab;
    local_810 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (pGVar7[2].intersectionFilterN +
                                  uVar62 * (long)pGVar7[2].pointQueryFunc),local_820,auVar143);
    local_830 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar7[2].intersectionFilterN +
                                 (long)pGVar7[2].pointQueryFunc * (uVar62 + 1)),_local_690,auVar143)
    ;
    auVar75 = vsubps_avx(local_820,auVar81);
    uVar127 = auVar75._0_4_;
    auVar144._4_4_ = uVar127;
    auVar144._0_4_ = uVar127;
    auVar144._8_4_ = uVar127;
    auVar144._12_4_ = uVar127;
    auVar80 = vshufps_avx(auVar75,auVar75,0x55);
    auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
    aVar3 = (local_748->vx).field_0;
    aVar4 = (local_748->vy).field_0;
    fVar148 = (local_748->vz).field_0.m128[0];
    fVar135 = *(float *)((long)&(local_748->vz).field_0 + 4);
    fVar136 = *(float *)((long)&(local_748->vz).field_0 + 8);
    fVar137 = *(float *)((long)&(local_748->vz).field_0 + 0xc);
    auVar176._0_4_ = fVar148 * auVar75._0_4_;
    auVar176._4_4_ = fVar135 * auVar75._4_4_;
    auVar176._8_4_ = fVar136 * auVar75._8_4_;
    auVar176._12_4_ = fVar137 * auVar75._12_4_;
    auVar80 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar4,auVar80);
    auVar24 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar3,auVar144);
    auVar75 = vsubps_avx(local_810,auVar81);
    uVar127 = auVar75._0_4_;
    auVar145._4_4_ = uVar127;
    auVar145._0_4_ = uVar127;
    auVar145._8_4_ = uVar127;
    auVar145._12_4_ = uVar127;
    auVar80 = vshufps_avx(auVar75,auVar75,0x55);
    auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
    auVar177._0_4_ = fVar148 * auVar75._0_4_;
    auVar177._4_4_ = fVar135 * auVar75._4_4_;
    auVar177._8_4_ = fVar136 * auVar75._8_4_;
    auVar177._12_4_ = fVar137 * auVar75._12_4_;
    auVar80 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar4,auVar80);
    auVar25 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar3,auVar145);
    auVar75 = vsubps_avx(local_830,auVar81);
    uVar127 = auVar75._0_4_;
    auVar146._4_4_ = uVar127;
    auVar146._0_4_ = uVar127;
    auVar146._8_4_ = uVar127;
    auVar146._12_4_ = uVar127;
    auVar80 = vshufps_avx(auVar75,auVar75,0x55);
    auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
    auVar179._0_4_ = fVar148 * auVar75._0_4_;
    auVar179._4_4_ = fVar135 * auVar75._4_4_;
    auVar179._8_4_ = fVar136 * auVar75._8_4_;
    auVar179._12_4_ = fVar137 * auVar75._12_4_;
    auVar80 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar4,auVar80);
    auVar76 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar3,auVar146);
    auVar80 = vsubps_avx(_local_690,auVar81);
    uVar127 = auVar80._0_4_;
    auVar140._4_4_ = uVar127;
    auVar140._0_4_ = uVar127;
    auVar140._8_4_ = uVar127;
    auVar140._12_4_ = uVar127;
    auVar81 = vshufps_avx(auVar80,auVar80,0x55);
    auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
    auVar183._0_4_ = fVar148 * auVar80._0_4_;
    auVar183._4_4_ = fVar135 * auVar80._4_4_;
    auVar183._8_4_ = fVar136 * auVar80._8_4_;
    auVar183._12_4_ = fVar137 * auVar80._12_4_;
    auVar81 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar4,auVar81);
    auVar26 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar3,auVar140);
    lVar70 = (long)iVar6 * 0x44;
    auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar70);
    uVar127 = auVar24._0_4_;
    local_700._4_4_ = uVar127;
    local_700._0_4_ = uVar127;
    local_700._8_4_ = uVar127;
    local_700._12_4_ = uVar127;
    local_700._16_4_ = uVar127;
    local_700._20_4_ = uVar127;
    local_700._24_4_ = uVar127;
    local_700._28_4_ = uVar127;
    auVar84._8_4_ = 1;
    auVar84._0_8_ = 0x100000001;
    auVar84._12_4_ = 1;
    auVar84._16_4_ = 1;
    auVar84._20_4_ = 1;
    auVar84._24_4_ = 1;
    auVar84._28_4_ = 1;
    local_720 = vpermps_avx2(auVar84,ZEXT1632(auVar24));
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x484);
    local_860 = vbroadcastss_avx512vl(auVar25);
    local_780 = vpermps_avx512vl(auVar84,ZEXT1632(auVar25));
    auVar191 = ZEXT3264(local_780);
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x908);
    local_7a0 = vbroadcastss_avx512vl(auVar76);
    auVar193 = ZEXT3264(local_7a0);
    local_7c0 = vpermps_avx512vl(auVar84,ZEXT1632(auVar76));
    auVar192 = ZEXT3264(local_7c0);
    auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0xd8c);
    local_7e0 = vbroadcastss_avx512vl(auVar26);
    auVar194 = ZEXT3264(local_7e0);
    local_800 = vpermps_avx512vl(auVar84,ZEXT1632(auVar26));
    auVar195 = ZEXT3264(local_800);
    auVar84 = vmulps_avx512vl(local_7e0,auVar95);
    auVar85 = vmulps_avx512vl(local_800,auVar95);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar96,local_7a0);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar96,local_7c0);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar98,local_860);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_780);
    auVar27 = vfmadd231ps_fma(auVar84,auVar97,local_700);
    auVar77 = vfmadd231ps_fma(auVar85,auVar97,local_720);
    auVar84 = *(undefined1 (*) [32])(bezier_basis1 + lVar70);
    auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x484);
    auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x908);
    auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0xd8c);
    auVar86 = vmulps_avx512vl(local_7e0,auVar93);
    auVar87 = vmulps_avx512vl(local_800,auVar93);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar94,local_7a0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,local_7c0);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar85,local_860);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar85,local_780);
    auVar28 = vfmadd231ps_fma(auVar86,auVar84,local_700);
    auVar78 = vfmadd231ps_fma(auVar87,auVar84,local_720);
    auVar86 = vsubps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar27));
    auVar87 = vsubps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar77));
    auVar88 = vmulps_avx512vl(ZEXT1632(auVar77),auVar86);
    auVar89 = vmulps_avx512vl(ZEXT1632(auVar27),auVar87);
    auVar88 = vsubps_avx512vl(auVar88,auVar89);
    auVar81 = vshufps_avx(local_810,local_810,0xff);
    local_360 = vbroadcastsd_avx512vl(auVar81);
    auVar81 = vshufps_avx(local_830,local_830,0xff);
    local_380 = vbroadcastsd_avx512vl(auVar81);
    _local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar65 + 0xc + lVar64)));
    auVar89 = vmulps_avx512vl(_local_3a0,auVar95);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,local_380);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar98,local_360);
    local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar65 + 0xc + lVar63)));
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,local_3c0);
    auVar90 = vmulps_avx512vl(_local_3a0,auVar93);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_380);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar85,local_360);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar84,local_3c0);
    auVar91 = vmulps_avx512vl(auVar87,auVar87);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,auVar86);
    auVar92 = vmaxps_avx512vl(auVar89,auVar90);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    auVar91 = vmulps_avx512vl(auVar92,auVar91);
    auVar88 = vmulps_avx512vl(auVar88,auVar88);
    uVar29 = vcmpps_avx512vl(auVar88,auVar91,2);
    auVar81 = vinsertps_avx512f(auVar24,local_3c0._0_16_,0x30);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar75 = vandps_avx512vl(auVar81,auVar80);
    auVar81 = vblendps_avx(auVar25,local_810,8);
    auVar81 = vandps_avx512vl(auVar81,auVar80);
    auVar75 = vmaxps_avx512vl(auVar75,auVar81);
    auVar81 = vblendps_avx(auVar76,local_830,8);
    auVar82 = vandps_avx512vl(auVar81,auVar80);
    auVar81 = vinsertps_avx512f(auVar26,local_3a0._0_16_,0x30);
    auVar81 = vandps_avx512vl(auVar81,auVar80);
    auVar81 = vmaxps_avx512vl(auVar82,auVar81);
    auVar81 = vmaxps_avx(auVar75,auVar81);
    auVar80 = vmovshdup_avx(auVar81);
    auVar80 = vmaxss_avx(auVar80,auVar81);
    auVar81 = vshufpd_avx(auVar81,auVar81,1);
    auVar75 = vcvtsi2ss_avx512f(auVar24,iVar6);
    auVar81 = vmaxss_avx(auVar81,auVar80);
    local_440._0_16_ = auVar75;
    auVar134 = local_440;
    auVar88 = vbroadcastss_avx512vl(auVar75);
    uVar30 = vcmpps_avx512vl(auVar88,_DAT_01f7b060,0xe);
    bVar72 = (byte)uVar29 & (byte)uVar30;
    auVar81 = vmulss_avx512f(auVar81,ZEXT416(0x35000000));
    auVar88._8_4_ = 2;
    auVar88._0_8_ = 0x200000002;
    auVar88._12_4_ = 2;
    auVar88._16_4_ = 2;
    auVar88._20_4_ = 2;
    auVar88._24_4_ = 2;
    auVar88._28_4_ = 2;
    local_6c0 = vpermps_avx512vl(auVar88,ZEXT1632(auVar24));
    auVar196 = ZEXT3264(local_6c0);
    local_6e0 = vpermps_avx512vl(auVar88,ZEXT1632(auVar25));
    auVar197 = ZEXT3264(local_6e0);
    local_3e0 = vpermps_avx512vl(auVar88,ZEXT1632(auVar76));
    local_400 = vpermps_avx512vl(auVar88,ZEXT1632(auVar26));
    auVar119 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar119);
    uVar175 = *(uint *)(ray + k * 4 + 0xc0);
    local_5e0 = auVar81._0_4_;
    uStack_5dc = auVar81._4_4_;
    uStack_5d8 = auVar81._8_4_;
    uStack_5d4 = auVar81._12_4_;
    auVar80 = local_3e0._0_16_;
    if (bVar72 == 0) {
      bVar66 = false;
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar187 = ZEXT3264(auVar97);
      auVar81 = vxorps_avx512vl(auVar80,auVar80);
      auVar188 = ZEXT1664(auVar81);
      auVar190 = ZEXT3264(local_700);
      auVar189 = ZEXT3264(local_720);
      auVar119 = ZEXT3264(local_860);
    }
    else {
      local_740._0_16_ = ZEXT416(uVar175);
      auVar93 = vmulps_avx512vl(local_400,auVar93);
      auVar94 = vfmadd213ps_avx512vl(auVar94,local_3e0,auVar93);
      auVar85 = vfmadd213ps_avx512vl(auVar85,local_6e0,auVar94);
      auVar93 = vfmadd213ps_avx512vl(auVar84,local_6c0,auVar85);
      auVar95 = vmulps_avx512vl(local_400,auVar95);
      auVar96 = vfmadd213ps_avx512vl(auVar96,local_3e0,auVar95);
      auVar85 = vfmadd213ps_avx512vl(auVar98,local_6e0,auVar96);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1210);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1694);
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1b18);
      auVar84 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1f9c);
      auVar88 = vfmadd213ps_avx512vl(auVar97,local_6c0,auVar85);
      auVar97 = vmulps_avx512vl(local_7e0,auVar84);
      auVar85 = vmulps_avx512vl(local_800,auVar84);
      auVar84 = vmulps_avx512vl(local_400,auVar84);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_7a0);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar95,local_7c0);
      auVar95 = vfmadd231ps_avx512vl(auVar84,local_3e0,auVar95);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,local_860);
      auVar84 = vfmadd231ps_avx512vl(auVar85,auVar96,local_780);
      auVar85 = vfmadd231ps_avx512vl(auVar95,local_6e0,auVar96);
      auVar94 = vfmadd231ps_avx512vl(auVar97,auVar98,local_700);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar98,local_720);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1210);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1b18);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1f9c);
      auVar85 = vfmadd231ps_avx512vl(auVar85,local_6c0,auVar98);
      auVar98 = vmulps_avx512vl(local_7e0,auVar95);
      auVar91 = vmulps_avx512vl(local_800,auVar95);
      auVar95 = vmulps_avx512vl(local_400,auVar95);
      auVar92 = vfmadd231ps_avx512vl(auVar98,auVar96,local_7a0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_7c0);
      auVar96 = vfmadd231ps_avx512vl(auVar95,local_3e0,auVar96);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1694);
      auVar95 = vfmadd231ps_avx512vl(auVar92,auVar98,local_860);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,local_780);
      auVar98 = vfmadd231ps_avx512vl(auVar96,local_6e0,auVar98);
      auVar96 = vfmadd231ps_avx512vl(auVar95,auVar97,local_700);
      auVar95 = vfmadd231ps_avx512vl(auVar91,auVar97,local_720);
      auVar91 = vfmadd231ps_avx512vl(auVar98,local_6c0,auVar97);
      auVar184._8_4_ = 0x7fffffff;
      auVar184._0_8_ = 0x7fffffff7fffffff;
      auVar184._12_4_ = 0x7fffffff;
      auVar184._16_4_ = 0x7fffffff;
      auVar184._20_4_ = 0x7fffffff;
      auVar184._24_4_ = 0x7fffffff;
      auVar184._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(auVar94,auVar184);
      auVar98 = vandps_avx(auVar84,auVar184);
      auVar98 = vmaxps_avx(auVar97,auVar98);
      auVar97 = vandps_avx(auVar85,auVar184);
      auVar97 = vmaxps_avx(auVar98,auVar97);
      auVar85 = vbroadcastss_avx512vl(auVar81);
      uVar62 = vcmpps_avx512vl(auVar97,auVar85,1);
      bVar66 = (bool)((byte)uVar62 & 1);
      auVar105._0_4_ = (float)((uint)bVar66 * auVar86._0_4_ | (uint)!bVar66 * auVar94._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar66 * auVar86._4_4_ | (uint)!bVar66 * auVar94._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar66 * auVar86._8_4_ | (uint)!bVar66 * auVar94._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar66 * auVar86._12_4_ | (uint)!bVar66 * auVar94._12_4_);
      bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar66 * auVar86._16_4_ | (uint)!bVar66 * auVar94._16_4_);
      bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar66 * auVar86._20_4_ | (uint)!bVar66 * auVar94._20_4_);
      bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar66 * auVar86._24_4_ | (uint)!bVar66 * auVar94._24_4_);
      bVar66 = SUB81(uVar62 >> 7,0);
      auVar105._28_4_ = (uint)bVar66 * auVar86._28_4_ | (uint)!bVar66 * auVar94._28_4_;
      bVar66 = (bool)((byte)uVar62 & 1);
      auVar106._0_4_ = (float)((uint)bVar66 * auVar87._0_4_ | (uint)!bVar66 * auVar84._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar66 * auVar87._4_4_ | (uint)!bVar66 * auVar84._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar66 * auVar87._8_4_ | (uint)!bVar66 * auVar84._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar66 * auVar87._12_4_ | (uint)!bVar66 * auVar84._12_4_);
      bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar106._16_4_ = (float)((uint)bVar66 * auVar87._16_4_ | (uint)!bVar66 * auVar84._16_4_);
      bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar106._20_4_ = (float)((uint)bVar66 * auVar87._20_4_ | (uint)!bVar66 * auVar84._20_4_);
      bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar106._24_4_ = (float)((uint)bVar66 * auVar87._24_4_ | (uint)!bVar66 * auVar84._24_4_);
      bVar66 = SUB81(uVar62 >> 7,0);
      auVar106._28_4_ = (uint)bVar66 * auVar87._28_4_ | (uint)!bVar66 * auVar84._28_4_;
      vandps_avx512vl(auVar96,auVar184);
      auVar97 = vandps_avx(auVar95,auVar184);
      auVar98 = vmaxps_avx(auVar106,auVar97);
      auVar97 = vandps_avx(auVar91,auVar184);
      auVar97 = vmaxps_avx(auVar98,auVar97);
      uVar62 = vcmpps_avx512vl(auVar97,auVar85,1);
      bVar66 = (bool)((byte)uVar62 & 1);
      auVar107._0_4_ = (uint)bVar66 * auVar86._0_4_ | (uint)!bVar66 * auVar96._0_4_;
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar66 * auVar86._4_4_ | (uint)!bVar66 * auVar96._4_4_;
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar66 * auVar86._8_4_ | (uint)!bVar66 * auVar96._8_4_;
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar66 * auVar86._12_4_ | (uint)!bVar66 * auVar96._12_4_;
      bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar107._16_4_ = (uint)bVar66 * auVar86._16_4_ | (uint)!bVar66 * auVar96._16_4_;
      bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar107._20_4_ = (uint)bVar66 * auVar86._20_4_ | (uint)!bVar66 * auVar96._20_4_;
      bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar107._24_4_ = (uint)bVar66 * auVar86._24_4_ | (uint)!bVar66 * auVar96._24_4_;
      bVar66 = SUB81(uVar62 >> 7,0);
      auVar107._28_4_ = (uint)bVar66 * auVar86._28_4_ | (uint)!bVar66 * auVar96._28_4_;
      bVar66 = (bool)((byte)uVar62 & 1);
      auVar108._0_4_ = (float)((uint)bVar66 * auVar87._0_4_ | (uint)!bVar66 * auVar95._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar66 * auVar87._4_4_ | (uint)!bVar66 * auVar95._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar66 * auVar87._8_4_ | (uint)!bVar66 * auVar95._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar66 * auVar87._12_4_ | (uint)!bVar66 * auVar95._12_4_);
      bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar66 * auVar87._16_4_ | (uint)!bVar66 * auVar95._16_4_);
      bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar66 * auVar87._20_4_ | (uint)!bVar66 * auVar95._20_4_);
      bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar66 * auVar87._24_4_ | (uint)!bVar66 * auVar95._24_4_);
      bVar66 = SUB81(uVar62 >> 7,0);
      auVar108._28_4_ = (uint)bVar66 * auVar87._28_4_ | (uint)!bVar66 * auVar95._28_4_;
      auVar180._8_4_ = 0x80000000;
      auVar180._0_8_ = 0x8000000080000000;
      auVar180._12_4_ = 0x80000000;
      auVar180._16_4_ = 0x80000000;
      auVar180._20_4_ = 0x80000000;
      auVar180._24_4_ = 0x80000000;
      auVar180._28_4_ = 0x80000000;
      auVar84 = vxorps_avx512vl(auVar107,auVar180);
      auVar83 = vxorps_avx512vl(auVar80,auVar80);
      auVar188 = ZEXT1664(auVar83);
      auVar97 = vfmadd213ps_avx512vl(auVar105,auVar105,ZEXT1632(auVar83));
      auVar81 = vfmadd231ps_fma(auVar97,auVar106,auVar106);
      auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      auVar185._8_4_ = 0xbf000000;
      auVar185._0_8_ = 0xbf000000bf000000;
      auVar185._12_4_ = 0xbf000000;
      auVar185._16_4_ = 0xbf000000;
      auVar185._20_4_ = 0xbf000000;
      auVar185._24_4_ = 0xbf000000;
      auVar185._28_4_ = 0xbf000000;
      fVar148 = auVar96._0_4_;
      fVar135 = auVar96._4_4_;
      fVar136 = auVar96._8_4_;
      fVar137 = auVar96._12_4_;
      fVar166 = auVar96._16_4_;
      fVar169 = auVar96._20_4_;
      fVar170 = auVar96._24_4_;
      auVar97._4_4_ = fVar135 * fVar135 * fVar135 * auVar81._4_4_ * -0.5;
      auVar97._0_4_ = fVar148 * fVar148 * fVar148 * auVar81._0_4_ * -0.5;
      auVar97._8_4_ = fVar136 * fVar136 * fVar136 * auVar81._8_4_ * -0.5;
      auVar97._12_4_ = fVar137 * fVar137 * fVar137 * auVar81._12_4_ * -0.5;
      auVar97._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
      auVar97._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
      auVar97._24_4_ = fVar170 * fVar170 * fVar170 * -0.0;
      auVar97._28_4_ = 0;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar85,auVar96);
      auVar98._4_4_ = auVar106._4_4_ * auVar97._4_4_;
      auVar98._0_4_ = auVar106._0_4_ * auVar97._0_4_;
      auVar98._8_4_ = auVar106._8_4_ * auVar97._8_4_;
      auVar98._12_4_ = auVar106._12_4_ * auVar97._12_4_;
      auVar98._16_4_ = auVar106._16_4_ * auVar97._16_4_;
      auVar98._20_4_ = auVar106._20_4_ * auVar97._20_4_;
      auVar98._24_4_ = auVar106._24_4_ * auVar97._24_4_;
      auVar98._28_4_ = auVar96._28_4_;
      auVar96._4_4_ = auVar97._4_4_ * -auVar105._4_4_;
      auVar96._0_4_ = auVar97._0_4_ * -auVar105._0_4_;
      auVar96._8_4_ = auVar97._8_4_ * -auVar105._8_4_;
      auVar96._12_4_ = auVar97._12_4_ * -auVar105._12_4_;
      auVar96._16_4_ = auVar97._16_4_ * -auVar105._16_4_;
      auVar96._20_4_ = auVar97._20_4_ * -auVar105._20_4_;
      auVar96._24_4_ = auVar97._24_4_ * -auVar105._24_4_;
      auVar96._28_4_ = auVar105._28_4_ ^ 0x80000000;
      auVar86 = vmulps_avx512vl(auVar97,ZEXT1632(auVar83));
      auVar91 = ZEXT1632(auVar83);
      auVar97 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar91);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar108,auVar108);
      auVar94 = vrsqrt14ps_avx512vl(auVar97);
      auVar97 = vmulps_avx512vl(auVar97,auVar185);
      fVar148 = auVar94._0_4_;
      fVar135 = auVar94._4_4_;
      fVar136 = auVar94._8_4_;
      fVar137 = auVar94._12_4_;
      fVar166 = auVar94._16_4_;
      fVar169 = auVar94._20_4_;
      fVar170 = auVar94._24_4_;
      auVar95._4_4_ = fVar135 * fVar135 * fVar135 * auVar97._4_4_;
      auVar95._0_4_ = fVar148 * fVar148 * fVar148 * auVar97._0_4_;
      auVar95._8_4_ = fVar136 * fVar136 * fVar136 * auVar97._8_4_;
      auVar95._12_4_ = fVar137 * fVar137 * fVar137 * auVar97._12_4_;
      auVar95._16_4_ = fVar166 * fVar166 * fVar166 * auVar97._16_4_;
      auVar95._20_4_ = fVar169 * fVar169 * fVar169 * auVar97._20_4_;
      auVar95._24_4_ = fVar170 * fVar170 * fVar170 * auVar97._24_4_;
      auVar95._28_4_ = 0xbf000000;
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar85,auVar94);
      auVar85._4_4_ = auVar108._4_4_ * auVar95._4_4_;
      auVar85._0_4_ = auVar108._0_4_ * auVar95._0_4_;
      auVar85._8_4_ = auVar108._8_4_ * auVar95._8_4_;
      auVar85._12_4_ = auVar108._12_4_ * auVar95._12_4_;
      auVar85._16_4_ = auVar108._16_4_ * auVar95._16_4_;
      auVar85._20_4_ = auVar108._20_4_ * auVar95._20_4_;
      auVar85._24_4_ = auVar108._24_4_ * auVar95._24_4_;
      auVar85._28_4_ = auVar94._28_4_;
      auVar94._4_4_ = auVar95._4_4_ * auVar84._4_4_;
      auVar94._0_4_ = auVar95._0_4_ * auVar84._0_4_;
      auVar94._8_4_ = auVar95._8_4_ * auVar84._8_4_;
      auVar94._12_4_ = auVar95._12_4_ * auVar84._12_4_;
      auVar94._16_4_ = auVar95._16_4_ * auVar84._16_4_;
      auVar94._20_4_ = auVar95._20_4_ * auVar84._20_4_;
      auVar94._24_4_ = auVar95._24_4_ * auVar84._24_4_;
      auVar94._28_4_ = auVar97._28_4_;
      auVar97 = vmulps_avx512vl(auVar95,auVar91);
      auVar81 = vfmadd213ps_fma(auVar98,auVar89,ZEXT1632(auVar27));
      auVar80 = vfmadd213ps_fma(auVar96,auVar89,ZEXT1632(auVar77));
      auVar95 = vfmadd213ps_avx512vl(auVar86,auVar89,auVar88);
      auVar84 = vfmadd213ps_avx512vl(auVar85,auVar90,ZEXT1632(auVar28));
      auVar82 = vfnmadd213ps_fma(auVar98,auVar89,ZEXT1632(auVar27));
      auVar24 = vfmadd213ps_fma(auVar94,auVar90,ZEXT1632(auVar78));
      auVar77 = vfnmadd213ps_fma(auVar96,auVar89,ZEXT1632(auVar77));
      auVar25 = vfmadd213ps_fma(auVar97,auVar90,auVar93);
      auVar79 = vfnmadd231ps_fma(auVar88,auVar89,auVar86);
      auVar28 = vfnmadd213ps_fma(auVar85,auVar90,ZEXT1632(auVar28));
      auVar78 = vfnmadd213ps_fma(auVar94,auVar90,ZEXT1632(auVar78));
      auVar128 = vfnmadd231ps_fma(auVar93,auVar90,auVar97);
      auVar96 = vsubps_avx512vl(auVar84,ZEXT1632(auVar82));
      auVar97 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar77));
      auVar98 = vsubps_avx(ZEXT1632(auVar25),ZEXT1632(auVar79));
      auVar93._4_4_ = auVar97._4_4_ * auVar79._4_4_;
      auVar93._0_4_ = auVar97._0_4_ * auVar79._0_4_;
      auVar93._8_4_ = auVar97._8_4_ * auVar79._8_4_;
      auVar93._12_4_ = auVar97._12_4_ * auVar79._12_4_;
      auVar93._16_4_ = auVar97._16_4_ * 0.0;
      auVar93._20_4_ = auVar97._20_4_ * 0.0;
      auVar93._24_4_ = auVar97._24_4_ * 0.0;
      auVar93._28_4_ = auVar86._28_4_;
      auVar76 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar77),auVar98);
      auVar86._4_4_ = auVar98._4_4_ * auVar82._4_4_;
      auVar86._0_4_ = auVar98._0_4_ * auVar82._0_4_;
      auVar86._8_4_ = auVar98._8_4_ * auVar82._8_4_;
      auVar86._12_4_ = auVar98._12_4_ * auVar82._12_4_;
      auVar86._16_4_ = auVar98._16_4_ * 0.0;
      auVar86._20_4_ = auVar98._20_4_ * 0.0;
      auVar86._24_4_ = auVar98._24_4_ * 0.0;
      auVar86._28_4_ = auVar98._28_4_;
      auVar26 = vfmsub231ps_fma(auVar86,ZEXT1632(auVar79),auVar96);
      auVar87._4_4_ = auVar77._4_4_ * auVar96._4_4_;
      auVar87._0_4_ = auVar77._0_4_ * auVar96._0_4_;
      auVar87._8_4_ = auVar77._8_4_ * auVar96._8_4_;
      auVar87._12_4_ = auVar77._12_4_ * auVar96._12_4_;
      auVar87._16_4_ = auVar96._16_4_ * 0.0;
      auVar87._20_4_ = auVar96._20_4_ * 0.0;
      auVar87._24_4_ = auVar96._24_4_ * 0.0;
      auVar87._28_4_ = auVar96._28_4_;
      auVar27 = vfmsub231ps_fma(auVar87,ZEXT1632(auVar82),auVar97);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar27),auVar91,ZEXT1632(auVar26));
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,ZEXT1632(auVar76));
      auVar105 = ZEXT1632(auVar83);
      uVar62 = vcmpps_avx512vl(auVar97,auVar105,2);
      bVar61 = (byte)uVar62;
      fVar73 = (float)((uint)(bVar61 & 1) * auVar81._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar28._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      fVar121 = (float)((uint)bVar66 * auVar81._4_4_ | (uint)!bVar66 * auVar28._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      fVar123 = (float)((uint)bVar66 * auVar81._8_4_ | (uint)!bVar66 * auVar28._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      fVar125 = (float)((uint)bVar66 * auVar81._12_4_ | (uint)!bVar66 * auVar28._12_4_);
      auVar94 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar73))));
      fVar74 = (float)((uint)(bVar61 & 1) * auVar80._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar78._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      fVar122 = (float)((uint)bVar66 * auVar80._4_4_ | (uint)!bVar66 * auVar78._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      fVar124 = (float)((uint)bVar66 * auVar80._8_4_ | (uint)!bVar66 * auVar78._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      fVar126 = (float)((uint)bVar66 * auVar80._12_4_ | (uint)!bVar66 * auVar78._12_4_);
      auVar93 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar74))));
      auVar99._0_4_ =
           (float)((uint)(bVar61 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar128._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar99._4_4_ = (float)((uint)bVar66 * auVar95._4_4_ | (uint)!bVar66 * auVar128._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar99._8_4_ = (float)((uint)bVar66 * auVar95._8_4_ | (uint)!bVar66 * auVar128._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar99._12_4_ = (float)((uint)bVar66 * auVar95._12_4_ | (uint)!bVar66 * auVar128._12_4_);
      fVar135 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar95._16_4_);
      auVar99._16_4_ = fVar135;
      fVar148 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar95._20_4_);
      auVar99._20_4_ = fVar148;
      fVar136 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar95._24_4_);
      auVar99._24_4_ = fVar136;
      iVar1 = (uint)(byte)(uVar62 >> 7) * auVar95._28_4_;
      auVar99._28_4_ = iVar1;
      auVar97 = vblendmps_avx512vl(ZEXT1632(auVar82),auVar84);
      auVar100._0_4_ =
           (uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar81._0_4_;
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar100._4_4_ = (uint)bVar66 * auVar97._4_4_ | (uint)!bVar66 * auVar81._4_4_;
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar100._8_4_ = (uint)bVar66 * auVar97._8_4_ | (uint)!bVar66 * auVar81._8_4_;
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar100._12_4_ = (uint)bVar66 * auVar97._12_4_ | (uint)!bVar66 * auVar81._12_4_;
      auVar100._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_;
      auVar100._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_;
      auVar100._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_;
      auVar100._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
      auVar97 = vblendmps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar24));
      auVar101._0_4_ =
           (float)((uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar76._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar66 * auVar97._4_4_ | (uint)!bVar66 * auVar76._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar66 * auVar97._8_4_ | (uint)!bVar66 * auVar76._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar66 * auVar97._12_4_ | (uint)!bVar66 * auVar76._12_4_);
      fVar137 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_);
      auVar101._16_4_ = fVar137;
      fVar166 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_);
      auVar101._20_4_ = fVar166;
      fVar169 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_);
      auVar101._24_4_ = fVar169;
      auVar101._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
      auVar97 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar25));
      auVar102._0_4_ =
           (float)((uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar80._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar66 * auVar97._4_4_ | (uint)!bVar66 * auVar80._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar66 * auVar97._8_4_ | (uint)!bVar66 * auVar80._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar66 * auVar97._12_4_ | (uint)!bVar66 * auVar80._12_4_);
      fVar170 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_);
      auVar102._16_4_ = fVar170;
      fVar171 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_);
      auVar102._20_4_ = fVar171;
      fVar172 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_);
      auVar102._24_4_ = fVar172;
      iVar2 = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
      auVar102._28_4_ = iVar2;
      auVar103._0_4_ =
           (uint)(bVar61 & 1) * (int)auVar82._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar84._0_4_;
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar103._4_4_ = (uint)bVar66 * (int)auVar82._4_4_ | (uint)!bVar66 * auVar84._4_4_;
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar103._8_4_ = (uint)bVar66 * (int)auVar82._8_4_ | (uint)!bVar66 * auVar84._8_4_;
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar103._12_4_ = (uint)bVar66 * (int)auVar82._12_4_ | (uint)!bVar66 * auVar84._12_4_;
      auVar103._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar84._16_4_;
      auVar103._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar84._20_4_;
      auVar103._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar84._24_4_;
      auVar103._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar84._28_4_;
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar86 = vsubps_avx512vl(auVar103,auVar94);
      auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar12 * (int)auVar77._12_4_ |
                                              (uint)!bVar12 * auVar24._12_4_,
                                              CONCAT48((uint)bVar10 * (int)auVar77._8_4_ |
                                                       (uint)!bVar10 * auVar24._8_4_,
                                                       CONCAT44((uint)bVar66 * (int)auVar77._4_4_ |
                                                                (uint)!bVar66 * auVar24._4_4_,
                                                                (uint)(bVar61 & 1) *
                                                                (int)auVar77._0_4_ |
                                                                (uint)!(bool)(bVar61 & 1) *
                                                                auVar24._0_4_)))),auVar93);
      auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar79._12_4_ |
                                              (uint)!bVar13 * auVar25._12_4_,
                                              CONCAT48((uint)bVar11 * (int)auVar79._8_4_ |
                                                       (uint)!bVar11 * auVar25._8_4_,
                                                       CONCAT44((uint)bVar9 * (int)auVar79._4_4_ |
                                                                (uint)!bVar9 * auVar25._4_4_,
                                                                (uint)(bVar61 & 1) *
                                                                (int)auVar79._0_4_ |
                                                                (uint)!(bool)(bVar61 & 1) *
                                                                auVar25._0_4_)))),auVar99);
      auVar95 = vsubps_avx(auVar94,auVar100);
      auVar84 = vsubps_avx(auVar93,auVar101);
      auVar85 = vsubps_avx(auVar99,auVar102);
      auVar91._4_4_ = auVar96._4_4_ * fVar121;
      auVar91._0_4_ = auVar96._0_4_ * fVar73;
      auVar91._8_4_ = auVar96._8_4_ * fVar123;
      auVar91._12_4_ = auVar96._12_4_ * fVar125;
      auVar91._16_4_ = auVar96._16_4_ * 0.0;
      auVar91._20_4_ = auVar96._20_4_ * 0.0;
      auVar91._24_4_ = auVar96._24_4_ * 0.0;
      auVar91._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar91,auVar99,auVar86);
      auVar154._0_4_ = fVar74 * auVar86._0_4_;
      auVar154._4_4_ = fVar122 * auVar86._4_4_;
      auVar154._8_4_ = fVar124 * auVar86._8_4_;
      auVar154._12_4_ = fVar126 * auVar86._12_4_;
      auVar154._16_4_ = auVar86._16_4_ * 0.0;
      auVar154._20_4_ = auVar86._20_4_ * 0.0;
      auVar154._24_4_ = auVar86._24_4_ * 0.0;
      auVar154._28_4_ = 0;
      auVar80 = vfmsub231ps_fma(auVar154,auVar94,auVar98);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar105,ZEXT1632(auVar81));
      auVar158._0_4_ = auVar98._0_4_ * auVar99._0_4_;
      auVar158._4_4_ = auVar98._4_4_ * auVar99._4_4_;
      auVar158._8_4_ = auVar98._8_4_ * auVar99._8_4_;
      auVar158._12_4_ = auVar98._12_4_ * auVar99._12_4_;
      auVar158._16_4_ = auVar98._16_4_ * fVar135;
      auVar158._20_4_ = auVar98._20_4_ * fVar148;
      auVar158._24_4_ = auVar98._24_4_ * fVar136;
      auVar158._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar158,auVar93,auVar96);
      auVar87 = vfmadd231ps_avx512vl(auVar97,auVar105,ZEXT1632(auVar81));
      auVar97 = vmulps_avx512vl(auVar85,auVar100);
      auVar97 = vfmsub231ps_avx512vl(auVar97,auVar95,auVar102);
      auVar92._4_4_ = auVar84._4_4_ * auVar102._4_4_;
      auVar92._0_4_ = auVar84._0_4_ * auVar102._0_4_;
      auVar92._8_4_ = auVar84._8_4_ * auVar102._8_4_;
      auVar92._12_4_ = auVar84._12_4_ * auVar102._12_4_;
      auVar92._16_4_ = auVar84._16_4_ * fVar170;
      auVar92._20_4_ = auVar84._20_4_ * fVar171;
      auVar92._24_4_ = auVar84._24_4_ * fVar172;
      auVar92._28_4_ = iVar2;
      auVar81 = vfmsub231ps_fma(auVar92,auVar101,auVar85);
      auVar159._0_4_ = auVar101._0_4_ * auVar95._0_4_;
      auVar159._4_4_ = auVar101._4_4_ * auVar95._4_4_;
      auVar159._8_4_ = auVar101._8_4_ * auVar95._8_4_;
      auVar159._12_4_ = auVar101._12_4_ * auVar95._12_4_;
      auVar159._16_4_ = fVar137 * auVar95._16_4_;
      auVar159._20_4_ = fVar166 * auVar95._20_4_;
      auVar159._24_4_ = fVar169 * auVar95._24_4_;
      auVar159._28_4_ = 0;
      auVar80 = vfmsub231ps_fma(auVar159,auVar84,auVar100);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar105,auVar97);
      auVar88 = vfmadd231ps_avx512vl(auVar97,auVar105,ZEXT1632(auVar81));
      auVar97 = vmaxps_avx(auVar87,auVar88);
      uVar29 = vcmpps_avx512vl(auVar97,auVar105,2);
      bVar72 = bVar72 & (byte)uVar29;
      auVar190 = ZEXT3264(local_700);
      auVar189 = ZEXT3264(local_720);
      auVar119 = ZEXT3264(local_860);
      if (bVar72 == 0) {
        bVar66 = false;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar187 = ZEXT3264(auVar97);
        auVar191 = ZEXT3264(local_780);
        auVar193 = ZEXT3264(local_7a0);
        auVar192 = ZEXT3264(local_7c0);
        auVar194 = ZEXT3264(local_7e0);
        auVar195 = ZEXT3264(local_800);
        auVar196 = ZEXT3264(local_6c0);
      }
      else {
        auVar36._4_4_ = auVar85._4_4_ * auVar98._4_4_;
        auVar36._0_4_ = auVar85._0_4_ * auVar98._0_4_;
        auVar36._8_4_ = auVar85._8_4_ * auVar98._8_4_;
        auVar36._12_4_ = auVar85._12_4_ * auVar98._12_4_;
        auVar36._16_4_ = auVar85._16_4_ * auVar98._16_4_;
        auVar36._20_4_ = auVar85._20_4_ * auVar98._20_4_;
        auVar36._24_4_ = auVar85._24_4_ * auVar98._24_4_;
        auVar36._28_4_ = auVar97._28_4_;
        auVar24 = vfmsub231ps_fma(auVar36,auVar84,auVar96);
        auVar37._4_4_ = auVar96._4_4_ * auVar95._4_4_;
        auVar37._0_4_ = auVar96._0_4_ * auVar95._0_4_;
        auVar37._8_4_ = auVar96._8_4_ * auVar95._8_4_;
        auVar37._12_4_ = auVar96._12_4_ * auVar95._12_4_;
        auVar37._16_4_ = auVar96._16_4_ * auVar95._16_4_;
        auVar37._20_4_ = auVar96._20_4_ * auVar95._20_4_;
        auVar37._24_4_ = auVar96._24_4_ * auVar95._24_4_;
        auVar37._28_4_ = auVar96._28_4_;
        auVar80 = vfmsub231ps_fma(auVar37,auVar86,auVar85);
        auVar38._4_4_ = auVar84._4_4_ * auVar86._4_4_;
        auVar38._0_4_ = auVar84._0_4_ * auVar86._0_4_;
        auVar38._8_4_ = auVar84._8_4_ * auVar86._8_4_;
        auVar38._12_4_ = auVar84._12_4_ * auVar86._12_4_;
        auVar38._16_4_ = auVar84._16_4_ * auVar86._16_4_;
        auVar38._20_4_ = auVar84._20_4_ * auVar86._20_4_;
        auVar38._24_4_ = auVar84._24_4_ * auVar86._24_4_;
        auVar38._28_4_ = auVar84._28_4_;
        auVar25 = vfmsub231ps_fma(auVar38,auVar95,auVar98);
        auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar25));
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar24),auVar105);
        auVar98 = vrcp14ps_avx512vl(auVar97);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar187 = ZEXT3264(auVar96);
        auVar95 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar96);
        auVar81 = vfmadd132ps_fma(auVar95,auVar98,auVar98);
        auVar39._4_4_ = auVar25._4_4_ * auVar99._4_4_;
        auVar39._0_4_ = auVar25._0_4_ * auVar99._0_4_;
        auVar39._8_4_ = auVar25._8_4_ * auVar99._8_4_;
        auVar39._12_4_ = auVar25._12_4_ * auVar99._12_4_;
        auVar39._16_4_ = fVar135 * 0.0;
        auVar39._20_4_ = fVar148 * 0.0;
        auVar39._24_4_ = fVar136 * 0.0;
        auVar39._28_4_ = iVar1;
        auVar80 = vfmadd231ps_fma(auVar39,auVar93,ZEXT1632(auVar80));
        auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar94,ZEXT1632(auVar24));
        fVar148 = auVar81._0_4_;
        fVar135 = auVar81._4_4_;
        fVar136 = auVar81._8_4_;
        fVar137 = auVar81._12_4_;
        local_560 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar137,
                                       CONCAT48(auVar80._8_4_ * fVar136,
                                                CONCAT44(auVar80._4_4_ * fVar135,
                                                         auVar80._0_4_ * fVar148))));
        auVar174._4_4_ = uVar175;
        auVar174._0_4_ = uVar175;
        auVar174._8_4_ = uVar175;
        auVar174._12_4_ = uVar175;
        auVar174._16_4_ = uVar175;
        auVar174._20_4_ = uVar175;
        auVar174._24_4_ = uVar175;
        auVar174._28_4_ = uVar175;
        uVar29 = vcmpps_avx512vl(auVar174,local_560,2);
        uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar32._4_4_ = uVar127;
        auVar32._0_4_ = uVar127;
        auVar32._8_4_ = uVar127;
        auVar32._12_4_ = uVar127;
        auVar32._16_4_ = uVar127;
        auVar32._20_4_ = uVar127;
        auVar32._24_4_ = uVar127;
        auVar32._28_4_ = uVar127;
        uVar30 = vcmpps_avx512vl(local_560,auVar32,2);
        bVar72 = (byte)uVar29 & (byte)uVar30 & bVar72;
        auVar191 = ZEXT3264(local_780);
        auVar193 = ZEXT3264(local_7a0);
        auVar192 = ZEXT3264(local_7c0);
        auVar194 = ZEXT3264(local_7e0);
        auVar195 = ZEXT3264(local_800);
        auVar196 = ZEXT3264(local_6c0);
        if (bVar72 != 0) {
          uVar29 = vcmpps_avx512vl(auVar97,auVar105,4);
          bVar72 = bVar72 & (byte)uVar29;
          if (bVar72 != 0) {
            fVar166 = auVar87._0_4_ * fVar148;
            fVar169 = auVar87._4_4_ * fVar135;
            auVar40._4_4_ = fVar169;
            auVar40._0_4_ = fVar166;
            fVar170 = auVar87._8_4_ * fVar136;
            auVar40._8_4_ = fVar170;
            fVar171 = auVar87._12_4_ * fVar137;
            auVar40._12_4_ = fVar171;
            fVar172 = auVar87._16_4_ * 0.0;
            auVar40._16_4_ = fVar172;
            fVar73 = auVar87._20_4_ * 0.0;
            auVar40._20_4_ = fVar73;
            fVar74 = auVar87._24_4_ * 0.0;
            auVar40._24_4_ = fVar74;
            auVar40._28_4_ = auVar97._28_4_;
            auVar98 = vsubps_avx512vl(auVar96,auVar40);
            local_5a0._0_4_ =
                 (float)((uint)(bVar61 & 1) * (int)fVar166 |
                        (uint)!(bool)(bVar61 & 1) * auVar98._0_4_);
            bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
            local_5a0._4_4_ = (float)((uint)bVar66 * (int)fVar169 | (uint)!bVar66 * auVar98._4_4_);
            bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
            local_5a0._8_4_ = (float)((uint)bVar66 * (int)fVar170 | (uint)!bVar66 * auVar98._8_4_);
            bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
            local_5a0._12_4_ = (float)((uint)bVar66 * (int)fVar171 | (uint)!bVar66 * auVar98._12_4_)
            ;
            bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
            local_5a0._16_4_ = (float)((uint)bVar66 * (int)fVar172 | (uint)!bVar66 * auVar98._16_4_)
            ;
            bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
            local_5a0._20_4_ = (float)((uint)bVar66 * (int)fVar73 | (uint)!bVar66 * auVar98._20_4_);
            bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
            local_5a0._24_4_ = (float)((uint)bVar66 * (int)fVar74 | (uint)!bVar66 * auVar98._24_4_);
            bVar66 = SUB81(uVar62 >> 7,0);
            local_5a0._28_4_ =
                 (float)((uint)bVar66 * auVar97._28_4_ | (uint)!bVar66 * auVar98._28_4_);
            auVar97 = vsubps_avx(auVar90,auVar89);
            auVar81 = vfmadd213ps_fma(auVar97,local_5a0,auVar89);
            uVar127 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar89._4_4_ = uVar127;
            auVar89._0_4_ = uVar127;
            auVar89._8_4_ = uVar127;
            auVar89._12_4_ = uVar127;
            auVar89._16_4_ = uVar127;
            auVar89._20_4_ = uVar127;
            auVar89._24_4_ = uVar127;
            auVar89._28_4_ = uVar127;
            auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                         CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                  CONCAT44(auVar81._4_4_ +
                                                                           auVar81._4_4_,
                                                                           auVar81._0_4_ +
                                                                           auVar81._0_4_)))),auVar89
                                     );
            uVar29 = vcmpps_avx512vl(local_560,auVar97,6);
            if (((byte)uVar29 & bVar72) != 0) {
              auVar147._0_4_ = auVar88._0_4_ * fVar148;
              auVar147._4_4_ = auVar88._4_4_ * fVar135;
              auVar147._8_4_ = auVar88._8_4_ * fVar136;
              auVar147._12_4_ = auVar88._12_4_ * fVar137;
              auVar147._16_4_ = auVar88._16_4_ * 0.0;
              auVar147._20_4_ = auVar88._20_4_ * 0.0;
              auVar147._24_4_ = auVar88._24_4_ * 0.0;
              auVar147._28_4_ = 0;
              auVar97 = vsubps_avx512vl(auVar96,auVar147);
              auVar104._0_4_ =
                   (uint)(bVar61 & 1) * (int)auVar147._0_4_ |
                   (uint)!(bool)(bVar61 & 1) * auVar97._0_4_;
              bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
              auVar104._4_4_ = (uint)bVar66 * (int)auVar147._4_4_ | (uint)!bVar66 * auVar97._4_4_;
              bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
              auVar104._8_4_ = (uint)bVar66 * (int)auVar147._8_4_ | (uint)!bVar66 * auVar97._8_4_;
              bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
              auVar104._12_4_ = (uint)bVar66 * (int)auVar147._12_4_ | (uint)!bVar66 * auVar97._12_4_
              ;
              bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
              auVar104._16_4_ = (uint)bVar66 * (int)auVar147._16_4_ | (uint)!bVar66 * auVar97._16_4_
              ;
              bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
              auVar104._20_4_ = (uint)bVar66 * (int)auVar147._20_4_ | (uint)!bVar66 * auVar97._20_4_
              ;
              bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
              auVar104._24_4_ = (uint)bVar66 * (int)auVar147._24_4_ | (uint)!bVar66 * auVar97._24_4_
              ;
              auVar104._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar97._28_4_;
              auVar90._8_4_ = 0x40000000;
              auVar90._0_8_ = 0x4000000040000000;
              auVar90._12_4_ = 0x40000000;
              auVar90._16_4_ = 0x40000000;
              auVar90._20_4_ = 0x40000000;
              auVar90._24_4_ = 0x40000000;
              auVar90._28_4_ = 0x40000000;
              local_580 = vfmsub132ps_avx512vl(auVar104,auVar96,auVar90);
              local_540 = 0;
              local_530 = local_820._0_8_;
              uStack_528 = local_820._8_8_;
              local_520 = local_810._0_8_;
              uStack_518 = local_810._8_8_;
              local_510 = local_830._0_8_;
              uStack_508 = local_830._8_8_;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar66 = true, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_017d703b;
                local_440._0_4_ = auVar75._0_4_;
                fVar148 = 1.0 / (float)local_440._0_4_;
                local_4e0[0] = fVar148 * (local_5a0._0_4_ + 0.0);
                local_4e0[1] = fVar148 * (local_5a0._4_4_ + 1.0);
                local_4e0[2] = fVar148 * (local_5a0._8_4_ + 2.0);
                local_4e0[3] = fVar148 * (local_5a0._12_4_ + 3.0);
                fStack_4d0 = fVar148 * (local_5a0._16_4_ + 4.0);
                fStack_4cc = fVar148 * (local_5a0._20_4_ + 5.0);
                fStack_4c8 = fVar148 * (local_5a0._24_4_ + 6.0);
                fStack_4c4 = local_5a0._28_4_ + 7.0;
                local_4c0 = local_580;
                local_4a0 = local_560;
                uVar62 = 0;
                uVar67 = (ulong)((byte)uVar29 & bVar72);
                for (uVar68 = uVar67; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000)
                {
                  uVar62 = uVar62 + 1;
                }
                auVar120 = vpbroadcastd_avx512f();
                local_480 = vmovdqa64_avx512f(auVar120);
                local_53c = iVar6;
                local_440 = auVar134;
                while (auVar81 = auVar188._0_16_, uVar67 != 0) {
                  uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_4e0[uVar62]));
                  local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_4c0 + uVar62 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4a0 + uVar62 * 4);
                  local_890.context = context->user;
                  fVar137 = local_200._0_4_;
                  fVar135 = 1.0 - fVar137;
                  fVar148 = fVar135 * fVar135 * -3.0;
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                            ZEXT416((uint)(fVar137 * fVar135)),ZEXT416(0xc0000000));
                  auVar75 = vfmsub132ss_fma(ZEXT416((uint)(fVar137 * fVar135)),
                                            ZEXT416((uint)(fVar137 * fVar137)),ZEXT416(0x40000000));
                  fVar135 = auVar80._0_4_ * 3.0;
                  fVar136 = auVar75._0_4_ * 3.0;
                  fVar137 = fVar137 * fVar137 * 3.0;
                  auVar164._0_4_ = fVar137 * (float)local_690._0_4_;
                  auVar164._4_4_ = fVar137 * (float)local_690._4_4_;
                  auVar164._8_4_ = fVar137 * fStack_688;
                  auVar164._12_4_ = fVar137 * fStack_684;
                  auVar130._4_4_ = fVar136;
                  auVar130._0_4_ = fVar136;
                  auVar130._8_4_ = fVar136;
                  auVar130._12_4_ = fVar136;
                  auVar80 = vfmadd132ps_fma(auVar130,auVar164,local_830);
                  auVar152._4_4_ = fVar135;
                  auVar152._0_4_ = fVar135;
                  auVar152._8_4_ = fVar135;
                  auVar152._12_4_ = fVar135;
                  auVar80 = vfmadd132ps_fma(auVar152,auVar80,local_810);
                  auVar131._4_4_ = fVar148;
                  auVar131._0_4_ = fVar148;
                  auVar131._8_4_ = fVar148;
                  auVar131._12_4_ = fVar148;
                  auVar80 = vfmadd132ps_fma(auVar131,auVar80,local_820);
                  auVar134 = vbroadcastss_avx512f(auVar80);
                  auVar120 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar120,ZEXT1664(auVar80));
                  auVar120 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar120,ZEXT1664(auVar80));
                  local_2c0[0] = (RTCHitN)auVar134[0];
                  local_2c0[1] = (RTCHitN)auVar134[1];
                  local_2c0[2] = (RTCHitN)auVar134[2];
                  local_2c0[3] = (RTCHitN)auVar134[3];
                  local_2c0[4] = (RTCHitN)auVar134[4];
                  local_2c0[5] = (RTCHitN)auVar134[5];
                  local_2c0[6] = (RTCHitN)auVar134[6];
                  local_2c0[7] = (RTCHitN)auVar134[7];
                  local_2c0[8] = (RTCHitN)auVar134[8];
                  local_2c0[9] = (RTCHitN)auVar134[9];
                  local_2c0[10] = (RTCHitN)auVar134[10];
                  local_2c0[0xb] = (RTCHitN)auVar134[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar134[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar134[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar134[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar134[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar134[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar134[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar134[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar134[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar134[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar134[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar134[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar134[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar134[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar134[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar134[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar134[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar134[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar134[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar134[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar134[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar134[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar134[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar134[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar134[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar134[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar134[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar134[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar134[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar134[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar134[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar134[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar134[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar134[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar134[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar134[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar134[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar134[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar134[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar134[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar134[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar134[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar134[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar134[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar134[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar134[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar134[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar134[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar134[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar134[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar134[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar134[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar134[0x3f];
                  local_180 = local_300._0_8_;
                  uStack_178 = local_300._8_8_;
                  uStack_170 = local_300._16_8_;
                  uStack_168 = local_300._24_8_;
                  uStack_160 = local_300._32_8_;
                  uStack_158 = local_300._40_8_;
                  uStack_150 = local_300._48_8_;
                  uStack_148 = local_300._56_8_;
                  auVar134 = vmovdqa64_avx512f(local_480);
                  local_140 = vmovdqa64_avx512f(auVar134);
                  vpcmpeqd_avx2(auVar134._0_32_,auVar134._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instPrimID[0]));
                  auVar134 = vmovdqa64_avx512f(local_340);
                  local_640 = vmovdqa64_avx512f(auVar134);
                  local_890.valid = (int *)local_640;
                  local_890.geometryUserPtr = pGVar7->userPtr;
                  local_890.hit = local_2c0;
                  local_890.N = 0x10;
                  local_660 = (uint)uVar67;
                  uStack_65c = (uint)(uVar67 >> 0x20);
                  local_680 = (undefined1  [8])uVar62;
                  auVar69 = (undefined1  [8])uVar62;
                  local_890.ray = (RTCRayN *)ray;
                  if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->occlusionFilterN)(&local_890);
                    uVar67 = CONCAT44(uStack_65c,local_660);
                    auVar197 = ZEXT3264(local_6e0);
                    auVar196 = ZEXT3264(local_6c0);
                    auVar192 = ZEXT3264(local_7c0);
                    auVar193 = ZEXT3264(local_7a0);
                    auVar191 = ZEXT3264(local_780);
                    auVar119 = ZEXT3264(local_860);
                    auVar189 = ZEXT3264(local_720);
                    auVar190 = ZEXT3264(local_700);
                    auVar81 = vxorps_avx512vl(auVar81,auVar81);
                    auVar188 = ZEXT1664(auVar81);
                    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar187 = ZEXT3264(auVar97);
                    auVar195 = ZEXT3264(local_800);
                    auVar194 = ZEXT3264(local_7e0);
                    auVar134 = vmovdqa64_avx512f(local_640);
                    auVar69 = local_680;
                    uVar175 = local_740._0_4_;
                  }
                  auVar81 = auVar188._0_16_;
                  uVar29 = vptestmd_avx512f(auVar134,auVar134);
                  if ((short)uVar29 != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&local_890);
                      uVar67 = CONCAT44(uStack_65c,local_660);
                      auVar197 = ZEXT3264(local_6e0);
                      auVar196 = ZEXT3264(local_6c0);
                      auVar192 = ZEXT3264(local_7c0);
                      auVar193 = ZEXT3264(local_7a0);
                      auVar191 = ZEXT3264(local_780);
                      auVar119 = ZEXT3264(local_860);
                      auVar189 = ZEXT3264(local_720);
                      auVar190 = ZEXT3264(local_700);
                      auVar81 = vxorps_avx512vl(auVar81,auVar81);
                      auVar188 = ZEXT1664(auVar81);
                      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar187 = ZEXT3264(auVar97);
                      auVar195 = ZEXT3264(local_800);
                      auVar194 = ZEXT3264(local_7e0);
                      auVar134 = vmovdqa64_avx512f(local_640);
                      auVar69 = local_680;
                      uVar175 = local_740._0_4_;
                    }
                    uVar62 = vptestmd_avx512f(auVar134,auVar134);
                    auVar134 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar66 = (bool)((byte)uVar62 & 1);
                    bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
                    bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
                    bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
                    bVar14 = (bool)((byte)(uVar62 >> 6) & 1);
                    bVar15 = (bool)((byte)(uVar62 >> 7) & 1);
                    bVar16 = (bool)((byte)(uVar62 >> 8) & 1);
                    bVar17 = (bool)((byte)(uVar62 >> 9) & 1);
                    bVar18 = (bool)((byte)(uVar62 >> 10) & 1);
                    bVar19 = (bool)((byte)(uVar62 >> 0xb) & 1);
                    bVar20 = (bool)((byte)(uVar62 >> 0xc) & 1);
                    bVar21 = (bool)((byte)(uVar62 >> 0xd) & 1);
                    bVar22 = (bool)((byte)(uVar62 >> 0xe) & 1);
                    bVar23 = SUB81(uVar62 >> 0xf,0);
                    *(uint *)(local_890.ray + 0x200) =
                         (uint)bVar66 * auVar134._0_4_ |
                         (uint)!bVar66 * *(int *)(local_890.ray + 0x200);
                    *(uint *)(local_890.ray + 0x204) =
                         (uint)bVar9 * auVar134._4_4_ |
                         (uint)!bVar9 * *(int *)(local_890.ray + 0x204);
                    *(uint *)(local_890.ray + 0x208) =
                         (uint)bVar10 * auVar134._8_4_ |
                         (uint)!bVar10 * *(int *)(local_890.ray + 0x208);
                    *(uint *)(local_890.ray + 0x20c) =
                         (uint)bVar11 * auVar134._12_4_ |
                         (uint)!bVar11 * *(int *)(local_890.ray + 0x20c);
                    *(uint *)(local_890.ray + 0x210) =
                         (uint)bVar12 * auVar134._16_4_ |
                         (uint)!bVar12 * *(int *)(local_890.ray + 0x210);
                    *(uint *)(local_890.ray + 0x214) =
                         (uint)bVar13 * auVar134._20_4_ |
                         (uint)!bVar13 * *(int *)(local_890.ray + 0x214);
                    *(uint *)(local_890.ray + 0x218) =
                         (uint)bVar14 * auVar134._24_4_ |
                         (uint)!bVar14 * *(int *)(local_890.ray + 0x218);
                    *(uint *)(local_890.ray + 0x21c) =
                         (uint)bVar15 * auVar134._28_4_ |
                         (uint)!bVar15 * *(int *)(local_890.ray + 0x21c);
                    *(uint *)(local_890.ray + 0x220) =
                         (uint)bVar16 * auVar134._32_4_ |
                         (uint)!bVar16 * *(int *)(local_890.ray + 0x220);
                    *(uint *)(local_890.ray + 0x224) =
                         (uint)bVar17 * auVar134._36_4_ |
                         (uint)!bVar17 * *(int *)(local_890.ray + 0x224);
                    *(uint *)(local_890.ray + 0x228) =
                         (uint)bVar18 * auVar134._40_4_ |
                         (uint)!bVar18 * *(int *)(local_890.ray + 0x228);
                    *(uint *)(local_890.ray + 0x22c) =
                         (uint)bVar19 * auVar134._44_4_ |
                         (uint)!bVar19 * *(int *)(local_890.ray + 0x22c);
                    *(uint *)(local_890.ray + 0x230) =
                         (uint)bVar20 * auVar134._48_4_ |
                         (uint)!bVar20 * *(int *)(local_890.ray + 0x230);
                    *(uint *)(local_890.ray + 0x234) =
                         (uint)bVar21 * auVar134._52_4_ |
                         (uint)!bVar21 * *(int *)(local_890.ray + 0x234);
                    *(uint *)(local_890.ray + 0x238) =
                         (uint)bVar22 * auVar134._56_4_ |
                         (uint)!bVar22 * *(int *)(local_890.ray + 0x238);
                    *(uint *)(local_890.ray + 0x23c) =
                         (uint)bVar23 * auVar134._60_4_ |
                         (uint)!bVar23 * *(int *)(local_890.ray + 0x23c);
                    if ((short)uVar62 != 0) {
                      bVar66 = true;
                      goto LAB_017d703b;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar127;
                  uVar62 = 0;
                  uVar67 = uVar67 ^ 1L << ((ulong)auVar69 & 0x3f);
                  for (uVar68 = uVar67; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000
                      ) {
                    uVar62 = uVar62 + 1;
                  }
                }
              }
            }
          }
        }
        bVar66 = false;
      }
    }
LAB_017d703b:
    if (8 < iVar6) {
      local_740 = vpbroadcastd_avx512vl();
      uStack_5dc = local_5e0;
      uStack_5d8 = local_5e0;
      uStack_5d4 = local_5e0;
      uStack_5d0 = local_5e0;
      uStack_5cc = local_5e0;
      uStack_5c8 = local_5e0;
      uStack_5c4 = local_5e0;
      local_680._0_4_ = 1.0 / (float)local_440._0_4_;
      local_680._4_4_ = local_680._0_4_;
      fStack_678 = (float)local_680._0_4_;
      fStack_674 = (float)local_680._0_4_;
      fStack_670 = (float)local_680._0_4_;
      fStack_66c = (float)local_680._0_4_;
      fStack_668 = (float)local_680._0_4_;
      register0x0000121c = local_680._0_4_;
      auVar134 = vpbroadcastd_avx512f();
      local_440 = vmovdqa64_avx512f(auVar134);
      local_660 = uVar175;
      uStack_65c = uVar175;
      uStack_658 = uVar175;
      uStack_654 = uVar175;
      uStack_650 = uVar175;
      uStack_64c = uVar175;
      uStack_648 = uVar175;
      uStack_644 = uVar175;
      for (lVar65 = 8; lVar65 < iVar6; lVar65 = lVar65 + 8) {
        auVar97 = vpbroadcastd_avx512vl();
        auVar84 = vpor_avx2(auVar97,_DAT_01fb4ba0);
        uVar30 = vpcmpd_avx512vl(auVar84,local_740,1);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 * 4 + lVar70);
        auVar98 = *(undefined1 (*) [32])(lVar70 + 0x21fb768 + lVar65 * 4);
        auVar96 = *(undefined1 (*) [32])(lVar70 + 0x21fbbec + lVar65 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar70 + 0x21fc070 + lVar65 * 4);
        local_7e0 = auVar194._0_32_;
        auVar85 = vmulps_avx512vl(local_7e0,auVar95);
        local_800 = auVar195._0_32_;
        auVar94 = vmulps_avx512vl(local_800,auVar95);
        auVar41._4_4_ = auVar95._4_4_ * (float)local_3a0._4_4_;
        auVar41._0_4_ = auVar95._0_4_ * (float)local_3a0._0_4_;
        auVar41._8_4_ = auVar95._8_4_ * fStack_398;
        auVar41._12_4_ = auVar95._12_4_ * fStack_394;
        auVar41._16_4_ = auVar95._16_4_ * fStack_390;
        auVar41._20_4_ = auVar95._20_4_ * fStack_38c;
        auVar41._24_4_ = auVar95._24_4_ * fStack_388;
        auVar41._28_4_ = auVar84._28_4_;
        local_7a0 = auVar193._0_32_;
        auVar84 = vfmadd231ps_avx512vl(auVar85,auVar96,local_7a0);
        local_7c0 = auVar192._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar94,auVar96,local_7c0);
        auVar81 = vfmadd231ps_fma(auVar41,auVar96,local_380);
        auVar99 = auVar119._0_32_;
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar98,auVar99);
        local_780 = auVar191._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_780);
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar98,local_360);
        auVar101 = auVar190._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar84,auVar97,auVar101);
        auVar100 = auVar189._0_32_;
        auVar89 = vfmadd231ps_avx512vl(auVar85,auVar97,auVar100);
        auVar84 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 * 4 + lVar70);
        auVar85 = *(undefined1 (*) [32])(lVar70 + 0x21fdb88 + lVar65 * 4);
        auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar97,local_3c0);
        auVar94 = *(undefined1 (*) [32])(lVar70 + 0x21fe00c + lVar65 * 4);
        auVar93 = *(undefined1 (*) [32])(lVar70 + 0x21fe490 + lVar65 * 4);
        auVar86 = vmulps_avx512vl(local_7e0,auVar93);
        auVar87 = vmulps_avx512vl(local_800,auVar93);
        auVar42._4_4_ = auVar93._4_4_ * (float)local_3a0._4_4_;
        auVar42._0_4_ = auVar93._0_4_ * (float)local_3a0._0_4_;
        auVar42._8_4_ = auVar93._8_4_ * fStack_398;
        auVar42._12_4_ = auVar93._12_4_ * fStack_394;
        auVar42._16_4_ = auVar93._16_4_ * fStack_390;
        auVar42._20_4_ = auVar93._20_4_ * fStack_38c;
        auVar42._24_4_ = auVar93._24_4_ * fStack_388;
        auVar42._28_4_ = uStack_384;
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar94,local_7a0);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,local_7c0);
        auVar81 = vfmadd231ps_fma(auVar42,auVar94,local_380);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar85,auVar99);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar85,local_780);
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar85,local_360);
        auVar91 = vfmadd231ps_avx512vl(auVar86,auVar84,auVar101);
        auVar92 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar100);
        auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar84,local_3c0);
        auVar106 = vmaxps_avx512vl(auVar90,auVar105);
        auVar86 = vsubps_avx(auVar91,auVar88);
        auVar87 = vsubps_avx(auVar92,auVar89);
        auVar107 = vmulps_avx512vl(auVar89,auVar86);
        auVar108 = vmulps_avx512vl(auVar88,auVar87);
        auVar107 = vsubps_avx512vl(auVar107,auVar108);
        auVar108 = vmulps_avx512vl(auVar87,auVar87);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar86,auVar86);
        auVar106 = vmulps_avx512vl(auVar106,auVar106);
        auVar106 = vmulps_avx512vl(auVar106,auVar108);
        auVar107 = vmulps_avx512vl(auVar107,auVar107);
        uVar29 = vcmpps_avx512vl(auVar107,auVar106,2);
        bVar72 = (byte)uVar30 & (byte)uVar29;
        if (bVar72 == 0) {
          auVar119 = ZEXT3264(auVar99);
        }
        else {
          auVar93 = vmulps_avx512vl(local_400,auVar93);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_3e0,auVar93);
          local_6e0 = auVar197._0_32_;
          auVar85 = vfmadd213ps_avx512vl(auVar85,local_6e0,auVar94);
          local_6c0 = auVar196._0_32_;
          auVar84 = vfmadd213ps_avx512vl(auVar84,local_6c0,auVar85);
          auVar95 = vmulps_avx512vl(local_400,auVar95);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_3e0,auVar95);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_6e0,auVar96);
          auVar85 = vfmadd213ps_avx512vl(auVar97,local_6c0,auVar98);
          auVar97 = *(undefined1 (*) [32])(lVar70 + 0x21fc4f4 + lVar65 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar70 + 0x21fc978 + lVar65 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar70 + 0x21fcdfc + lVar65 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar70 + 0x21fd280 + lVar65 * 4);
          auVar94 = vmulps_avx512vl(local_7e0,auVar95);
          auVar93 = vmulps_avx512vl(local_800,auVar95);
          auVar95 = vmulps_avx512vl(local_400,auVar95);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,local_7a0);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_7c0);
          auVar96 = vfmadd231ps_avx512vl(auVar95,local_3e0,auVar96);
          auVar95 = vfmadd231ps_avx512vl(auVar94,auVar98,auVar99);
          auVar94 = vfmadd231ps_avx512vl(auVar93,auVar98,local_780);
          auVar98 = vfmadd231ps_avx512vl(auVar96,local_6e0,auVar98);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar101);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,auVar100);
          auVar93 = vfmadd231ps_avx512vl(auVar98,local_6c0,auVar97);
          auVar97 = *(undefined1 (*) [32])(lVar70 + 0x21fe914 + lVar65 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar70 + 0x21ff21c + lVar65 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar70 + 0x21ff6a0 + lVar65 * 4);
          auVar106 = vmulps_avx512vl(local_7e0,auVar96);
          auVar107 = vmulps_avx512vl(local_800,auVar96);
          auVar96 = vmulps_avx512vl(local_400,auVar96);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,local_7a0);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,local_7c0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_3e0,auVar98);
          auVar98 = *(undefined1 (*) [32])(lVar70 + 0x21fed98 + lVar65 * 4);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,auVar99);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,local_780);
          auVar98 = vfmadd231ps_avx512vl(auVar96,local_6e0,auVar98);
          auVar96 = vfmadd231ps_avx512vl(auVar106,auVar97,auVar101);
          auVar106 = vfmadd231ps_avx512vl(auVar107,auVar97,auVar100);
          auVar98 = vfmadd231ps_avx512vl(auVar98,local_6c0,auVar97);
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar95,auVar107);
          vandps_avx512vl(auVar94,auVar107);
          auVar97 = vmaxps_avx(auVar107,auVar107);
          vandps_avx512vl(auVar93,auVar107);
          auVar97 = vmaxps_avx(auVar97,auVar107);
          auVar60._4_4_ = uStack_5dc;
          auVar60._0_4_ = local_5e0;
          auVar60._8_4_ = uStack_5d8;
          auVar60._12_4_ = uStack_5d4;
          auVar60._16_4_ = uStack_5d0;
          auVar60._20_4_ = uStack_5cc;
          auVar60._24_4_ = uStack_5c8;
          auVar60._28_4_ = uStack_5c4;
          uVar62 = vcmpps_avx512vl(auVar97,auVar60,1);
          bVar9 = (bool)((byte)uVar62 & 1);
          auVar109._0_4_ = (float)((uint)bVar9 * auVar86._0_4_ | (uint)!bVar9 * auVar95._0_4_);
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar109._4_4_ = (float)((uint)bVar9 * auVar86._4_4_ | (uint)!bVar9 * auVar95._4_4_);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar109._8_4_ = (float)((uint)bVar9 * auVar86._8_4_ | (uint)!bVar9 * auVar95._8_4_);
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar109._12_4_ = (float)((uint)bVar9 * auVar86._12_4_ | (uint)!bVar9 * auVar95._12_4_);
          bVar9 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar109._16_4_ = (float)((uint)bVar9 * auVar86._16_4_ | (uint)!bVar9 * auVar95._16_4_);
          bVar9 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar109._20_4_ = (float)((uint)bVar9 * auVar86._20_4_ | (uint)!bVar9 * auVar95._20_4_);
          bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar109._24_4_ = (float)((uint)bVar9 * auVar86._24_4_ | (uint)!bVar9 * auVar95._24_4_);
          bVar9 = SUB81(uVar62 >> 7,0);
          auVar109._28_4_ = (uint)bVar9 * auVar86._28_4_ | (uint)!bVar9 * auVar95._28_4_;
          bVar9 = (bool)((byte)uVar62 & 1);
          auVar110._0_4_ = (float)((uint)bVar9 * auVar87._0_4_ | (uint)!bVar9 * auVar94._0_4_);
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar110._4_4_ = (float)((uint)bVar9 * auVar87._4_4_ | (uint)!bVar9 * auVar94._4_4_);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar110._8_4_ = (float)((uint)bVar9 * auVar87._8_4_ | (uint)!bVar9 * auVar94._8_4_);
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar110._12_4_ = (float)((uint)bVar9 * auVar87._12_4_ | (uint)!bVar9 * auVar94._12_4_);
          bVar9 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar110._16_4_ = (float)((uint)bVar9 * auVar87._16_4_ | (uint)!bVar9 * auVar94._16_4_);
          bVar9 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar110._20_4_ = (float)((uint)bVar9 * auVar87._20_4_ | (uint)!bVar9 * auVar94._20_4_);
          bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar110._24_4_ = (float)((uint)bVar9 * auVar87._24_4_ | (uint)!bVar9 * auVar94._24_4_);
          bVar9 = SUB81(uVar62 >> 7,0);
          auVar110._28_4_ = (uint)bVar9 * auVar87._28_4_ | (uint)!bVar9 * auVar94._28_4_;
          vandps_avx512vl(auVar96,auVar107);
          vandps_avx512vl(auVar106,auVar107);
          auVar97 = vmaxps_avx(auVar110,auVar110);
          vandps_avx512vl(auVar98,auVar107);
          auVar97 = vmaxps_avx(auVar97,auVar110);
          uVar62 = vcmpps_avx512vl(auVar97,auVar60,1);
          bVar9 = (bool)((byte)uVar62 & 1);
          auVar111._0_4_ = (uint)bVar9 * auVar86._0_4_ | (uint)!bVar9 * auVar96._0_4_;
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar111._4_4_ = (uint)bVar9 * auVar86._4_4_ | (uint)!bVar9 * auVar96._4_4_;
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar111._8_4_ = (uint)bVar9 * auVar86._8_4_ | (uint)!bVar9 * auVar96._8_4_;
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar111._12_4_ = (uint)bVar9 * auVar86._12_4_ | (uint)!bVar9 * auVar96._12_4_;
          bVar9 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar111._16_4_ = (uint)bVar9 * auVar86._16_4_ | (uint)!bVar9 * auVar96._16_4_;
          bVar9 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar111._20_4_ = (uint)bVar9 * auVar86._20_4_ | (uint)!bVar9 * auVar96._20_4_;
          bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar111._24_4_ = (uint)bVar9 * auVar86._24_4_ | (uint)!bVar9 * auVar96._24_4_;
          bVar9 = SUB81(uVar62 >> 7,0);
          auVar111._28_4_ = (uint)bVar9 * auVar86._28_4_ | (uint)!bVar9 * auVar96._28_4_;
          bVar9 = (bool)((byte)uVar62 & 1);
          auVar112._0_4_ = (float)((uint)bVar9 * auVar87._0_4_ | (uint)!bVar9 * auVar106._0_4_);
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar112._4_4_ = (float)((uint)bVar9 * auVar87._4_4_ | (uint)!bVar9 * auVar106._4_4_);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar112._8_4_ = (float)((uint)bVar9 * auVar87._8_4_ | (uint)!bVar9 * auVar106._8_4_);
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar112._12_4_ = (float)((uint)bVar9 * auVar87._12_4_ | (uint)!bVar9 * auVar106._12_4_);
          bVar9 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar112._16_4_ = (float)((uint)bVar9 * auVar87._16_4_ | (uint)!bVar9 * auVar106._16_4_);
          bVar9 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar112._20_4_ = (float)((uint)bVar9 * auVar87._20_4_ | (uint)!bVar9 * auVar106._20_4_);
          bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar112._24_4_ = (float)((uint)bVar9 * auVar87._24_4_ | (uint)!bVar9 * auVar106._24_4_);
          bVar9 = SUB81(uVar62 >> 7,0);
          auVar112._28_4_ = (uint)bVar9 * auVar87._28_4_ | (uint)!bVar9 * auVar106._28_4_;
          auVar178._8_4_ = 0x80000000;
          auVar178._0_8_ = 0x8000000080000000;
          auVar178._12_4_ = 0x80000000;
          auVar178._16_4_ = 0x80000000;
          auVar178._20_4_ = 0x80000000;
          auVar178._24_4_ = 0x80000000;
          auVar178._28_4_ = 0x80000000;
          auVar97 = vxorps_avx512vl(auVar111,auVar178);
          auVar106 = auVar188._0_32_;
          auVar98 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar106);
          auVar81 = vfmadd231ps_fma(auVar98,auVar110,auVar110);
          auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
          auVar186._8_4_ = 0xbf000000;
          auVar186._0_8_ = 0xbf000000bf000000;
          auVar186._12_4_ = 0xbf000000;
          auVar186._16_4_ = 0xbf000000;
          auVar186._20_4_ = 0xbf000000;
          auVar186._24_4_ = 0xbf000000;
          auVar186._28_4_ = 0xbf000000;
          fVar148 = auVar98._0_4_;
          fVar135 = auVar98._4_4_;
          fVar136 = auVar98._8_4_;
          fVar137 = auVar98._12_4_;
          fVar166 = auVar98._16_4_;
          fVar169 = auVar98._20_4_;
          fVar170 = auVar98._24_4_;
          auVar43._4_4_ = fVar135 * fVar135 * fVar135 * auVar81._4_4_ * -0.5;
          auVar43._0_4_ = fVar148 * fVar148 * fVar148 * auVar81._0_4_ * -0.5;
          auVar43._8_4_ = fVar136 * fVar136 * fVar136 * auVar81._8_4_ * -0.5;
          auVar43._12_4_ = fVar137 * fVar137 * fVar137 * auVar81._12_4_ * -0.5;
          auVar43._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
          auVar43._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar43._24_4_ = fVar170 * fVar170 * fVar170 * -0.0;
          auVar43._28_4_ = auVar110._28_4_;
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar98 = vfmadd231ps_avx512vl(auVar43,auVar96,auVar98);
          auVar44._4_4_ = auVar110._4_4_ * auVar98._4_4_;
          auVar44._0_4_ = auVar110._0_4_ * auVar98._0_4_;
          auVar44._8_4_ = auVar110._8_4_ * auVar98._8_4_;
          auVar44._12_4_ = auVar110._12_4_ * auVar98._12_4_;
          auVar44._16_4_ = auVar110._16_4_ * auVar98._16_4_;
          auVar44._20_4_ = auVar110._20_4_ * auVar98._20_4_;
          auVar44._24_4_ = auVar110._24_4_ * auVar98._24_4_;
          auVar44._28_4_ = 0;
          auVar45._4_4_ = auVar98._4_4_ * -auVar109._4_4_;
          auVar45._0_4_ = auVar98._0_4_ * -auVar109._0_4_;
          auVar45._8_4_ = auVar98._8_4_ * -auVar109._8_4_;
          auVar45._12_4_ = auVar98._12_4_ * -auVar109._12_4_;
          auVar45._16_4_ = auVar98._16_4_ * -auVar109._16_4_;
          auVar45._20_4_ = auVar98._20_4_ * -auVar109._20_4_;
          auVar45._24_4_ = auVar98._24_4_ * -auVar109._24_4_;
          auVar45._28_4_ = auVar110._28_4_;
          auVar95 = vmulps_avx512vl(auVar98,auVar106);
          auVar98 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar106);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar112,auVar112);
          auVar94 = vrsqrt14ps_avx512vl(auVar98);
          auVar98 = vmulps_avx512vl(auVar98,auVar186);
          fVar148 = auVar94._0_4_;
          fVar135 = auVar94._4_4_;
          fVar136 = auVar94._8_4_;
          fVar137 = auVar94._12_4_;
          fVar166 = auVar94._16_4_;
          fVar169 = auVar94._20_4_;
          fVar170 = auVar94._24_4_;
          auVar46._4_4_ = fVar135 * fVar135 * fVar135 * auVar98._4_4_;
          auVar46._0_4_ = fVar148 * fVar148 * fVar148 * auVar98._0_4_;
          auVar46._8_4_ = fVar136 * fVar136 * fVar136 * auVar98._8_4_;
          auVar46._12_4_ = fVar137 * fVar137 * fVar137 * auVar98._12_4_;
          auVar46._16_4_ = fVar166 * fVar166 * fVar166 * auVar98._16_4_;
          auVar46._20_4_ = fVar169 * fVar169 * fVar169 * auVar98._20_4_;
          auVar46._24_4_ = fVar170 * fVar170 * fVar170 * auVar98._24_4_;
          auVar46._28_4_ = auVar98._28_4_;
          auVar98 = vfmadd231ps_avx512vl(auVar46,auVar96,auVar94);
          auVar47._4_4_ = auVar112._4_4_ * auVar98._4_4_;
          auVar47._0_4_ = auVar112._0_4_ * auVar98._0_4_;
          auVar47._8_4_ = auVar112._8_4_ * auVar98._8_4_;
          auVar47._12_4_ = auVar112._12_4_ * auVar98._12_4_;
          auVar47._16_4_ = auVar112._16_4_ * auVar98._16_4_;
          auVar47._20_4_ = auVar112._20_4_ * auVar98._20_4_;
          auVar47._24_4_ = auVar112._24_4_ * auVar98._24_4_;
          auVar47._28_4_ = auVar94._28_4_;
          auVar48._4_4_ = auVar98._4_4_ * auVar97._4_4_;
          auVar48._0_4_ = auVar98._0_4_ * auVar97._0_4_;
          auVar48._8_4_ = auVar98._8_4_ * auVar97._8_4_;
          auVar48._12_4_ = auVar98._12_4_ * auVar97._12_4_;
          auVar48._16_4_ = auVar98._16_4_ * auVar97._16_4_;
          auVar48._20_4_ = auVar98._20_4_ * auVar97._20_4_;
          auVar48._24_4_ = auVar98._24_4_ * auVar97._24_4_;
          auVar48._28_4_ = auVar97._28_4_;
          auVar97 = vmulps_avx512vl(auVar98,auVar106);
          auVar81 = vfmadd213ps_fma(auVar44,auVar90,auVar88);
          auVar80 = vfmadd213ps_fma(auVar45,auVar90,auVar89);
          auVar96 = vfmadd213ps_avx512vl(auVar95,auVar90,auVar85);
          auVar94 = vfmadd213ps_avx512vl(auVar47,auVar105,auVar91);
          auVar27 = vfnmadd213ps_fma(auVar44,auVar90,auVar88);
          auVar75 = vfmadd213ps_fma(auVar48,auVar105,auVar92);
          auVar77 = vfnmadd213ps_fma(auVar45,auVar90,auVar89);
          auVar24 = vfmadd213ps_fma(auVar97,auVar105,auVar84);
          auVar82 = vfnmadd231ps_fma(auVar85,auVar90,auVar95);
          auVar28 = vfnmadd213ps_fma(auVar47,auVar105,auVar91);
          auVar78 = vfnmadd213ps_fma(auVar48,auVar105,auVar92);
          auVar79 = vfnmadd231ps_fma(auVar84,auVar105,auVar97);
          auVar84 = vsubps_avx512vl(auVar94,ZEXT1632(auVar27));
          auVar97 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar77));
          auVar98 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar82));
          auVar49._4_4_ = auVar97._4_4_ * auVar82._4_4_;
          auVar49._0_4_ = auVar97._0_4_ * auVar82._0_4_;
          auVar49._8_4_ = auVar97._8_4_ * auVar82._8_4_;
          auVar49._12_4_ = auVar97._12_4_ * auVar82._12_4_;
          auVar49._16_4_ = auVar97._16_4_ * 0.0;
          auVar49._20_4_ = auVar97._20_4_ * 0.0;
          auVar49._24_4_ = auVar97._24_4_ * 0.0;
          auVar49._28_4_ = auVar95._28_4_;
          auVar25 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar77),auVar98);
          auVar50._4_4_ = auVar98._4_4_ * auVar27._4_4_;
          auVar50._0_4_ = auVar98._0_4_ * auVar27._0_4_;
          auVar50._8_4_ = auVar98._8_4_ * auVar27._8_4_;
          auVar50._12_4_ = auVar98._12_4_ * auVar27._12_4_;
          auVar50._16_4_ = auVar98._16_4_ * 0.0;
          auVar50._20_4_ = auVar98._20_4_ * 0.0;
          auVar50._24_4_ = auVar98._24_4_ * 0.0;
          auVar50._28_4_ = auVar98._28_4_;
          auVar76 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar82),auVar84);
          auVar51._4_4_ = auVar77._4_4_ * auVar84._4_4_;
          auVar51._0_4_ = auVar77._0_4_ * auVar84._0_4_;
          auVar51._8_4_ = auVar77._8_4_ * auVar84._8_4_;
          auVar51._12_4_ = auVar77._12_4_ * auVar84._12_4_;
          auVar51._16_4_ = auVar84._16_4_ * 0.0;
          auVar51._20_4_ = auVar84._20_4_ * 0.0;
          auVar51._24_4_ = auVar84._24_4_ * 0.0;
          auVar51._28_4_ = auVar84._28_4_;
          auVar26 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar27),auVar97);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar26),auVar106,ZEXT1632(auVar76));
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar106,ZEXT1632(auVar25));
          uVar62 = vcmpps_avx512vl(auVar97,auVar106,2);
          bVar61 = (byte)uVar62;
          fVar73 = (float)((uint)(bVar61 & 1) * auVar81._0_4_ |
                          (uint)!(bool)(bVar61 & 1) * auVar28._0_4_);
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          fVar121 = (float)((uint)bVar9 * auVar81._4_4_ | (uint)!bVar9 * auVar28._4_4_);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          fVar123 = (float)((uint)bVar9 * auVar81._8_4_ | (uint)!bVar9 * auVar28._8_4_);
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          fVar125 = (float)((uint)bVar9 * auVar81._12_4_ | (uint)!bVar9 * auVar28._12_4_);
          auVar93 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar73))));
          fVar74 = (float)((uint)(bVar61 & 1) * auVar80._0_4_ |
                          (uint)!(bool)(bVar61 & 1) * auVar78._0_4_);
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          fVar122 = (float)((uint)bVar9 * auVar80._4_4_ | (uint)!bVar9 * auVar78._4_4_);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          fVar124 = (float)((uint)bVar9 * auVar80._8_4_ | (uint)!bVar9 * auVar78._8_4_);
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          fVar126 = (float)((uint)bVar9 * auVar80._12_4_ | (uint)!bVar9 * auVar78._12_4_);
          auVar86 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar74))));
          auVar113._0_4_ =
               (float)((uint)(bVar61 & 1) * auVar96._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar79._0_4_);
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar113._4_4_ = (float)((uint)bVar9 * auVar96._4_4_ | (uint)!bVar9 * auVar79._4_4_);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar113._8_4_ = (float)((uint)bVar9 * auVar96._8_4_ | (uint)!bVar9 * auVar79._8_4_);
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar113._12_4_ = (float)((uint)bVar9 * auVar96._12_4_ | (uint)!bVar9 * auVar79._12_4_);
          fVar136 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar96._16_4_);
          auVar113._16_4_ = fVar136;
          fVar148 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar96._20_4_);
          auVar113._20_4_ = fVar148;
          fVar135 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar96._24_4_);
          auVar113._24_4_ = fVar135;
          iVar1 = (uint)(byte)(uVar62 >> 7) * auVar96._28_4_;
          auVar113._28_4_ = iVar1;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar27),auVar94);
          auVar114._0_4_ =
               (uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar25._0_4_;
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar114._4_4_ = (uint)bVar9 * auVar97._4_4_ | (uint)!bVar9 * auVar25._4_4_;
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar114._8_4_ = (uint)bVar9 * auVar97._8_4_ | (uint)!bVar9 * auVar25._8_4_;
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar114._12_4_ = (uint)bVar9 * auVar97._12_4_ | (uint)!bVar9 * auVar25._12_4_;
          auVar114._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_;
          auVar114._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_;
          auVar114._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_;
          auVar114._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar75));
          auVar115._0_4_ =
               (float)((uint)(bVar61 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar81._0_4_);
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar9 * auVar97._4_4_ | (uint)!bVar9 * auVar81._4_4_);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar9 * auVar97._8_4_ | (uint)!bVar9 * auVar81._8_4_);
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar9 * auVar97._12_4_ | (uint)!bVar9 * auVar81._12_4_);
          fVar166 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_);
          auVar115._16_4_ = fVar166;
          fVar169 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_);
          auVar115._20_4_ = fVar169;
          fVar137 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_);
          auVar115._24_4_ = fVar137;
          auVar115._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar24));
          auVar116._0_4_ =
               (float)((uint)(bVar61 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar80._0_4_);
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar9 * auVar97._4_4_ | (uint)!bVar9 * auVar80._4_4_);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar9 * auVar97._8_4_ | (uint)!bVar9 * auVar80._8_4_);
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar9 * auVar97._12_4_ | (uint)!bVar9 * auVar80._12_4_);
          fVar170 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_);
          auVar116._16_4_ = fVar170;
          fVar171 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_);
          auVar116._20_4_ = fVar171;
          fVar172 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_);
          auVar116._24_4_ = fVar172;
          iVar2 = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
          auVar116._28_4_ = iVar2;
          auVar117._0_4_ =
               (uint)(bVar61 & 1) * (int)auVar27._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar94._0_4_;
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar9 * (int)auVar27._4_4_ | (uint)!bVar9 * auVar94._4_4_;
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar9 * (int)auVar27._8_4_ | (uint)!bVar9 * auVar94._8_4_;
          bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar9 * (int)auVar27._12_4_ | (uint)!bVar9 * auVar94._12_4_;
          auVar117._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar94._16_4_;
          auVar117._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar94._20_4_;
          auVar117._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar94._24_4_;
          auVar117._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar94._28_4_;
          bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar94 = vsubps_avx512vl(auVar117,auVar93);
          auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar77._12_4_ |
                                                  (uint)!bVar13 * auVar75._12_4_,
                                                  CONCAT48((uint)bVar11 * (int)auVar77._8_4_ |
                                                           (uint)!bVar11 * auVar75._8_4_,
                                                           CONCAT44((uint)bVar9 * (int)auVar77._4_4_
                                                                    | (uint)!bVar9 * auVar75._4_4_,
                                                                    (uint)(bVar61 & 1) *
                                                                    (int)auVar77._0_4_ |
                                                                    (uint)!(bool)(bVar61 & 1) *
                                                                    auVar75._0_4_)))),auVar86);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar82._12_4_ |
                                                  (uint)!bVar14 * auVar24._12_4_,
                                                  CONCAT48((uint)bVar12 * (int)auVar82._8_4_ |
                                                           (uint)!bVar12 * auVar24._8_4_,
                                                           CONCAT44((uint)bVar10 *
                                                                    (int)auVar82._4_4_ |
                                                                    (uint)!bVar10 * auVar24._4_4_,
                                                                    (uint)(bVar61 & 1) *
                                                                    (int)auVar82._0_4_ |
                                                                    (uint)!(bool)(bVar61 & 1) *
                                                                    auVar24._0_4_)))),auVar113);
          auVar95 = vsubps_avx(auVar93,auVar114);
          auVar84 = vsubps_avx(auVar86,auVar115);
          auVar85 = vsubps_avx(auVar113,auVar116);
          auVar52._4_4_ = auVar96._4_4_ * fVar121;
          auVar52._0_4_ = auVar96._0_4_ * fVar73;
          auVar52._8_4_ = auVar96._8_4_ * fVar123;
          auVar52._12_4_ = auVar96._12_4_ * fVar125;
          auVar52._16_4_ = auVar96._16_4_ * 0.0;
          auVar52._20_4_ = auVar96._20_4_ * 0.0;
          auVar52._24_4_ = auVar96._24_4_ * 0.0;
          auVar52._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar52,auVar113,auVar94);
          auVar155._0_4_ = fVar74 * auVar94._0_4_;
          auVar155._4_4_ = fVar122 * auVar94._4_4_;
          auVar155._8_4_ = fVar124 * auVar94._8_4_;
          auVar155._12_4_ = fVar126 * auVar94._12_4_;
          auVar155._16_4_ = auVar94._16_4_ * 0.0;
          auVar155._20_4_ = auVar94._20_4_ * 0.0;
          auVar155._24_4_ = auVar94._24_4_ * 0.0;
          auVar155._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar155,auVar93,auVar98);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar106,ZEXT1632(auVar81));
          auVar160._0_4_ = auVar98._0_4_ * auVar113._0_4_;
          auVar160._4_4_ = auVar98._4_4_ * auVar113._4_4_;
          auVar160._8_4_ = auVar98._8_4_ * auVar113._8_4_;
          auVar160._12_4_ = auVar98._12_4_ * auVar113._12_4_;
          auVar160._16_4_ = auVar98._16_4_ * fVar136;
          auVar160._20_4_ = auVar98._20_4_ * fVar148;
          auVar160._24_4_ = auVar98._24_4_ * fVar135;
          auVar160._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar160,auVar86,auVar96);
          auVar87 = vfmadd231ps_avx512vl(auVar97,auVar106,ZEXT1632(auVar81));
          auVar97 = vmulps_avx512vl(auVar85,auVar114);
          auVar97 = vfmsub231ps_avx512vl(auVar97,auVar95,auVar116);
          auVar53._4_4_ = auVar84._4_4_ * auVar116._4_4_;
          auVar53._0_4_ = auVar84._0_4_ * auVar116._0_4_;
          auVar53._8_4_ = auVar84._8_4_ * auVar116._8_4_;
          auVar53._12_4_ = auVar84._12_4_ * auVar116._12_4_;
          auVar53._16_4_ = auVar84._16_4_ * fVar170;
          auVar53._20_4_ = auVar84._20_4_ * fVar171;
          auVar53._24_4_ = auVar84._24_4_ * fVar172;
          auVar53._28_4_ = iVar2;
          auVar81 = vfmsub231ps_fma(auVar53,auVar115,auVar85);
          auVar161._0_4_ = auVar115._0_4_ * auVar95._0_4_;
          auVar161._4_4_ = auVar115._4_4_ * auVar95._4_4_;
          auVar161._8_4_ = auVar115._8_4_ * auVar95._8_4_;
          auVar161._12_4_ = auVar115._12_4_ * auVar95._12_4_;
          auVar161._16_4_ = fVar166 * auVar95._16_4_;
          auVar161._20_4_ = fVar169 * auVar95._20_4_;
          auVar161._24_4_ = fVar137 * auVar95._24_4_;
          auVar161._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar161,auVar84,auVar114);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar106,auVar97);
          auVar88 = vfmadd231ps_avx512vl(auVar97,auVar106,ZEXT1632(auVar81));
          auVar97 = vmaxps_avx(auVar87,auVar88);
          uVar29 = vcmpps_avx512vl(auVar97,auVar106,2);
          bVar72 = bVar72 & (byte)uVar29;
          if (bVar72 != 0) {
            auVar54._4_4_ = auVar85._4_4_ * auVar98._4_4_;
            auVar54._0_4_ = auVar85._0_4_ * auVar98._0_4_;
            auVar54._8_4_ = auVar85._8_4_ * auVar98._8_4_;
            auVar54._12_4_ = auVar85._12_4_ * auVar98._12_4_;
            auVar54._16_4_ = auVar85._16_4_ * auVar98._16_4_;
            auVar54._20_4_ = auVar85._20_4_ * auVar98._20_4_;
            auVar54._24_4_ = auVar85._24_4_ * auVar98._24_4_;
            auVar54._28_4_ = auVar97._28_4_;
            auVar75 = vfmsub231ps_fma(auVar54,auVar84,auVar96);
            auVar55._4_4_ = auVar96._4_4_ * auVar95._4_4_;
            auVar55._0_4_ = auVar96._0_4_ * auVar95._0_4_;
            auVar55._8_4_ = auVar96._8_4_ * auVar95._8_4_;
            auVar55._12_4_ = auVar96._12_4_ * auVar95._12_4_;
            auVar55._16_4_ = auVar96._16_4_ * auVar95._16_4_;
            auVar55._20_4_ = auVar96._20_4_ * auVar95._20_4_;
            auVar55._24_4_ = auVar96._24_4_ * auVar95._24_4_;
            auVar55._28_4_ = auVar96._28_4_;
            auVar80 = vfmsub231ps_fma(auVar55,auVar94,auVar85);
            auVar56._4_4_ = auVar84._4_4_ * auVar94._4_4_;
            auVar56._0_4_ = auVar84._0_4_ * auVar94._0_4_;
            auVar56._8_4_ = auVar84._8_4_ * auVar94._8_4_;
            auVar56._12_4_ = auVar84._12_4_ * auVar94._12_4_;
            auVar56._16_4_ = auVar84._16_4_ * auVar94._16_4_;
            auVar56._20_4_ = auVar84._20_4_ * auVar94._20_4_;
            auVar56._24_4_ = auVar84._24_4_ * auVar94._24_4_;
            auVar56._28_4_ = auVar84._28_4_;
            auVar24 = vfmsub231ps_fma(auVar56,auVar95,auVar98);
            auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar24));
            auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar75),auVar106);
            auVar98 = vrcp14ps_avx512vl(auVar97);
            auVar95 = auVar187._0_32_;
            auVar96 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar95);
            auVar81 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
            auVar57._4_4_ = auVar24._4_4_ * auVar113._4_4_;
            auVar57._0_4_ = auVar24._0_4_ * auVar113._0_4_;
            auVar57._8_4_ = auVar24._8_4_ * auVar113._8_4_;
            auVar57._12_4_ = auVar24._12_4_ * auVar113._12_4_;
            auVar57._16_4_ = fVar136 * 0.0;
            auVar57._20_4_ = fVar148 * 0.0;
            auVar57._24_4_ = fVar135 * 0.0;
            auVar57._28_4_ = iVar1;
            auVar80 = vfmadd231ps_fma(auVar57,auVar86,ZEXT1632(auVar80));
            auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar93,ZEXT1632(auVar75));
            fVar148 = auVar81._0_4_;
            fVar135 = auVar81._4_4_;
            fVar136 = auVar81._8_4_;
            fVar137 = auVar81._12_4_;
            local_560 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar137,
                                           CONCAT48(auVar80._8_4_ * fVar136,
                                                    CONCAT44(auVar80._4_4_ * fVar135,
                                                             auVar80._0_4_ * fVar148))));
            auVar59._4_4_ = uStack_65c;
            auVar59._0_4_ = local_660;
            auVar59._8_4_ = uStack_658;
            auVar59._12_4_ = uStack_654;
            auVar59._16_4_ = uStack_650;
            auVar59._20_4_ = uStack_64c;
            auVar59._24_4_ = uStack_648;
            auVar59._28_4_ = uStack_644;
            uVar29 = vcmpps_avx512vl(local_560,auVar59,0xd);
            uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar33._4_4_ = uVar127;
            auVar33._0_4_ = uVar127;
            auVar33._8_4_ = uVar127;
            auVar33._12_4_ = uVar127;
            auVar33._16_4_ = uVar127;
            auVar33._20_4_ = uVar127;
            auVar33._24_4_ = uVar127;
            auVar33._28_4_ = uVar127;
            uVar30 = vcmpps_avx512vl(local_560,auVar33,2);
            bVar72 = (byte)uVar29 & (byte)uVar30 & bVar72;
            if (bVar72 != 0) {
              uVar29 = vcmpps_avx512vl(auVar97,auVar106,4);
              bVar72 = bVar72 & (byte)uVar29;
              auVar119 = ZEXT3264(local_860);
              if (bVar72 != 0) {
                fVar166 = auVar87._0_4_ * fVar148;
                fVar169 = auVar87._4_4_ * fVar135;
                auVar58._4_4_ = fVar169;
                auVar58._0_4_ = fVar166;
                fVar170 = auVar87._8_4_ * fVar136;
                auVar58._8_4_ = fVar170;
                fVar171 = auVar87._12_4_ * fVar137;
                auVar58._12_4_ = fVar171;
                fVar172 = auVar87._16_4_ * 0.0;
                auVar58._16_4_ = fVar172;
                fVar73 = auVar87._20_4_ * 0.0;
                auVar58._20_4_ = fVar73;
                fVar74 = auVar87._24_4_ * 0.0;
                auVar58._24_4_ = fVar74;
                auVar58._28_4_ = auVar97._28_4_;
                auVar98 = vsubps_avx512vl(auVar95,auVar58);
                local_5a0._0_4_ =
                     (float)((uint)(bVar61 & 1) * (int)fVar166 |
                            (uint)!(bool)(bVar61 & 1) * auVar98._0_4_);
                bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
                local_5a0._4_4_ = (float)((uint)bVar9 * (int)fVar169 | (uint)!bVar9 * auVar98._4_4_)
                ;
                bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                local_5a0._8_4_ = (float)((uint)bVar9 * (int)fVar170 | (uint)!bVar9 * auVar98._8_4_)
                ;
                bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
                local_5a0._12_4_ =
                     (float)((uint)bVar9 * (int)fVar171 | (uint)!bVar9 * auVar98._12_4_);
                bVar9 = (bool)((byte)(uVar62 >> 4) & 1);
                local_5a0._16_4_ =
                     (float)((uint)bVar9 * (int)fVar172 | (uint)!bVar9 * auVar98._16_4_);
                bVar9 = (bool)((byte)(uVar62 >> 5) & 1);
                local_5a0._20_4_ =
                     (float)((uint)bVar9 * (int)fVar73 | (uint)!bVar9 * auVar98._20_4_);
                bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
                local_5a0._24_4_ =
                     (float)((uint)bVar9 * (int)fVar74 | (uint)!bVar9 * auVar98._24_4_);
                bVar9 = SUB81(uVar62 >> 7,0);
                local_5a0._28_4_ =
                     (float)((uint)bVar9 * auVar97._28_4_ | (uint)!bVar9 * auVar98._28_4_);
                auVar97 = vsubps_avx(auVar105,auVar90);
                auVar81 = vfmadd213ps_fma(auVar97,local_5a0,auVar90);
                uVar127 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar34._4_4_ = uVar127;
                auVar34._0_4_ = uVar127;
                auVar34._8_4_ = uVar127;
                auVar34._12_4_ = uVar127;
                auVar34._16_4_ = uVar127;
                auVar34._20_4_ = uVar127;
                auVar34._24_4_ = uVar127;
                auVar34._28_4_ = uVar127;
                auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                             CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                      CONCAT44(auVar81._4_4_ +
                                                                               auVar81._4_4_,
                                                                               auVar81._0_4_ +
                                                                               auVar81._0_4_)))),
                                          auVar34);
                uVar29 = vcmpps_avx512vl(local_560,auVar97,6);
                if (((byte)uVar29 & bVar72) != 0) {
                  auVar141._0_4_ = auVar88._0_4_ * fVar148;
                  auVar141._4_4_ = auVar88._4_4_ * fVar135;
                  auVar141._8_4_ = auVar88._8_4_ * fVar136;
                  auVar141._12_4_ = auVar88._12_4_ * fVar137;
                  auVar141._16_4_ = auVar88._16_4_ * 0.0;
                  auVar141._20_4_ = auVar88._20_4_ * 0.0;
                  auVar141._24_4_ = auVar88._24_4_ * 0.0;
                  auVar141._28_4_ = 0;
                  auVar97 = vsubps_avx512vl(auVar95,auVar141);
                  auVar118._0_4_ =
                       (uint)(bVar61 & 1) * (int)auVar141._0_4_ |
                       (uint)!(bool)(bVar61 & 1) * auVar97._0_4_;
                  bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
                  auVar118._4_4_ = (uint)bVar9 * (int)auVar141._4_4_ | (uint)!bVar9 * auVar97._4_4_;
                  bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                  auVar118._8_4_ = (uint)bVar9 * (int)auVar141._8_4_ | (uint)!bVar9 * auVar97._8_4_;
                  bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
                  auVar118._12_4_ =
                       (uint)bVar9 * (int)auVar141._12_4_ | (uint)!bVar9 * auVar97._12_4_;
                  bVar9 = (bool)((byte)(uVar62 >> 4) & 1);
                  auVar118._16_4_ =
                       (uint)bVar9 * (int)auVar141._16_4_ | (uint)!bVar9 * auVar97._16_4_;
                  bVar9 = (bool)((byte)(uVar62 >> 5) & 1);
                  auVar118._20_4_ =
                       (uint)bVar9 * (int)auVar141._20_4_ | (uint)!bVar9 * auVar97._20_4_;
                  bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
                  auVar118._24_4_ =
                       (uint)bVar9 * (int)auVar141._24_4_ | (uint)!bVar9 * auVar97._24_4_;
                  auVar118._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar97._28_4_;
                  auVar35._8_4_ = 0x40000000;
                  auVar35._0_8_ = 0x4000000040000000;
                  auVar35._12_4_ = 0x40000000;
                  auVar35._16_4_ = 0x40000000;
                  auVar35._20_4_ = 0x40000000;
                  auVar35._24_4_ = 0x40000000;
                  auVar35._28_4_ = 0x40000000;
                  local_580 = vfmsub132ps_avx512vl(auVar118,auVar95,auVar35);
                  local_540 = (undefined4)lVar65;
                  local_530 = local_820._0_8_;
                  uStack_528 = local_820._8_8_;
                  local_520 = local_810._0_8_;
                  uStack_518 = local_810._8_8_;
                  local_510 = local_830._0_8_;
                  uStack_508 = local_830._8_8_;
                  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                    bVar61 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar61 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar81 = vcvtsi2ss_avx512f(auVar187._0_16_,local_540);
                    fVar148 = auVar81._0_4_;
                    local_4e0[0] = (fVar148 + local_5a0._0_4_ + 0.0) * (float)local_680._0_4_;
                    local_4e0[1] = (fVar148 + local_5a0._4_4_ + 1.0) * (float)local_680._4_4_;
                    local_4e0[2] = (fVar148 + local_5a0._8_4_ + 2.0) * fStack_678;
                    local_4e0[3] = (fVar148 + local_5a0._12_4_ + 3.0) * fStack_674;
                    fStack_4d0 = (fVar148 + local_5a0._16_4_ + 4.0) * fStack_670;
                    fStack_4cc = (fVar148 + local_5a0._20_4_ + 5.0) * fStack_66c;
                    fStack_4c8 = (fVar148 + local_5a0._24_4_ + 6.0) * fStack_668;
                    fStack_4c4 = fVar148 + local_5a0._28_4_ + 7.0;
                    local_4c0 = local_580;
                    local_4a0 = local_560;
                    uVar62 = 0;
                    uVar67 = (ulong)((byte)uVar29 & bVar72);
                    for (uVar68 = uVar67; local_53c = iVar6, (uVar68 & 1) == 0;
                        uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                      uVar62 = uVar62 + 1;
                    }
                    while (auVar81 = auVar188._0_16_, uVar67 != 0) {
                      uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_4e0[uVar62]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_4c0 + uVar62 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4a0 + uVar62 * 4)
                      ;
                      local_890.context = context->user;
                      fVar137 = local_200._0_4_;
                      fVar135 = 1.0 - fVar137;
                      fVar148 = fVar135 * fVar135 * -3.0;
                      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                                ZEXT416((uint)(fVar137 * fVar135)),
                                                ZEXT416(0xc0000000));
                      auVar80 = vfmsub132ss_fma(ZEXT416((uint)(fVar137 * fVar135)),
                                                ZEXT416((uint)(fVar137 * fVar137)),
                                                ZEXT416(0x40000000));
                      fVar135 = auVar81._0_4_ * 3.0;
                      fVar136 = auVar80._0_4_ * 3.0;
                      fVar137 = fVar137 * fVar137 * 3.0;
                      auVar165._0_4_ = fVar137 * (float)local_690._0_4_;
                      auVar165._4_4_ = fVar137 * (float)local_690._4_4_;
                      auVar165._8_4_ = fVar137 * fStack_688;
                      auVar165._12_4_ = fVar137 * fStack_684;
                      auVar132._4_4_ = fVar136;
                      auVar132._0_4_ = fVar136;
                      auVar132._8_4_ = fVar136;
                      auVar132._12_4_ = fVar136;
                      auVar81 = vfmadd132ps_fma(auVar132,auVar165,local_830);
                      auVar153._4_4_ = fVar135;
                      auVar153._0_4_ = fVar135;
                      auVar153._8_4_ = fVar135;
                      auVar153._12_4_ = fVar135;
                      auVar81 = vfmadd132ps_fma(auVar153,auVar81,local_810);
                      auVar133._4_4_ = fVar148;
                      auVar133._0_4_ = fVar148;
                      auVar133._8_4_ = fVar148;
                      auVar133._12_4_ = fVar148;
                      auVar81 = vfmadd132ps_fma(auVar133,auVar81,local_820);
                      auVar134 = vbroadcastss_avx512f(auVar81);
                      auVar119 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar119,ZEXT1664(auVar81));
                      auVar119 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar119,ZEXT1664(auVar81));
                      local_2c0[0] = (RTCHitN)auVar134[0];
                      local_2c0[1] = (RTCHitN)auVar134[1];
                      local_2c0[2] = (RTCHitN)auVar134[2];
                      local_2c0[3] = (RTCHitN)auVar134[3];
                      local_2c0[4] = (RTCHitN)auVar134[4];
                      local_2c0[5] = (RTCHitN)auVar134[5];
                      local_2c0[6] = (RTCHitN)auVar134[6];
                      local_2c0[7] = (RTCHitN)auVar134[7];
                      local_2c0[8] = (RTCHitN)auVar134[8];
                      local_2c0[9] = (RTCHitN)auVar134[9];
                      local_2c0[10] = (RTCHitN)auVar134[10];
                      local_2c0[0xb] = (RTCHitN)auVar134[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar134[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar134[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar134[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar134[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar134[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar134[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar134[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar134[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar134[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar134[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar134[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar134[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar134[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar134[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar134[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar134[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar134[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar134[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar134[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar134[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar134[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar134[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar134[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar134[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar134[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar134[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar134[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar134[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar134[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar134[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar134[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar134[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar134[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar134[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar134[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar134[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar134[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar134[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar134[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar134[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar134[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar134[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar134[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar134[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar134[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar134[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar134[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar134[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar134[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar134[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar134[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar134[0x3f];
                      local_180 = local_300._0_8_;
                      uStack_178 = local_300._8_8_;
                      uStack_170 = local_300._16_8_;
                      uStack_168 = local_300._24_8_;
                      uStack_160 = local_300._32_8_;
                      uStack_158 = local_300._40_8_;
                      uStack_150 = local_300._48_8_;
                      uStack_148 = local_300._56_8_;
                      auVar134 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar134);
                      vpcmpeqd_avx2(auVar134._0_32_,auVar134._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instPrimID[0]));
                      auVar134 = vmovdqa64_avx512f(local_340);
                      local_640 = vmovdqa64_avx512f(auVar134);
                      local_890.valid = (int *)local_640;
                      local_890.geometryUserPtr = pGVar7->userPtr;
                      local_890.hit = local_2c0;
                      local_890.N = 0x10;
                      local_480._0_8_ = uVar62;
                      uVar68 = uVar62;
                      local_890.ray = (RTCRayN *)ray;
                      if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar7->occlusionFilterN)(&local_890);
                        auVar134 = vmovdqa64_avx512f(local_640);
                        uVar68 = local_480._0_8_;
                      }
                      uVar29 = vptestmd_avx512f(auVar134,auVar134);
                      if ((short)uVar29 != 0) {
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var8)(&local_890);
                          auVar134 = vmovdqa64_avx512f(local_640);
                          uVar68 = local_480._0_8_;
                        }
                        auVar81 = auVar188._0_16_;
                        uVar62 = vptestmd_avx512f(auVar134,auVar134);
                        auVar119 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar9 = (bool)((byte)uVar62 & 1);
                        auVar134._0_4_ =
                             (uint)bVar9 * auVar119._0_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x200);
                        bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
                        auVar134._4_4_ =
                             (uint)bVar9 * auVar119._4_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x204);
                        bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
                        auVar134._8_4_ =
                             (uint)bVar9 * auVar119._8_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x208);
                        bVar9 = (bool)((byte)(uVar62 >> 3) & 1);
                        auVar134._12_4_ =
                             (uint)bVar9 * auVar119._12_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x20c);
                        bVar9 = (bool)((byte)(uVar62 >> 4) & 1);
                        auVar134._16_4_ =
                             (uint)bVar9 * auVar119._16_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x210);
                        bVar9 = (bool)((byte)(uVar62 >> 5) & 1);
                        auVar134._20_4_ =
                             (uint)bVar9 * auVar119._20_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x214);
                        bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
                        auVar134._24_4_ =
                             (uint)bVar9 * auVar119._24_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x218);
                        bVar9 = (bool)((byte)(uVar62 >> 7) & 1);
                        auVar134._28_4_ =
                             (uint)bVar9 * auVar119._28_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x21c);
                        bVar9 = (bool)((byte)(uVar62 >> 8) & 1);
                        auVar134._32_4_ =
                             (uint)bVar9 * auVar119._32_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x220);
                        bVar9 = (bool)((byte)(uVar62 >> 9) & 1);
                        auVar134._36_4_ =
                             (uint)bVar9 * auVar119._36_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x224);
                        bVar9 = (bool)((byte)(uVar62 >> 10) & 1);
                        auVar134._40_4_ =
                             (uint)bVar9 * auVar119._40_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x228);
                        bVar9 = (bool)((byte)(uVar62 >> 0xb) & 1);
                        auVar134._44_4_ =
                             (uint)bVar9 * auVar119._44_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x22c);
                        bVar9 = (bool)((byte)(uVar62 >> 0xc) & 1);
                        auVar134._48_4_ =
                             (uint)bVar9 * auVar119._48_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x230);
                        bVar9 = (bool)((byte)(uVar62 >> 0xd) & 1);
                        auVar134._52_4_ =
                             (uint)bVar9 * auVar119._52_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x234);
                        bVar9 = (bool)((byte)(uVar62 >> 0xe) & 1);
                        auVar134._56_4_ =
                             (uint)bVar9 * auVar119._56_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x238);
                        bVar9 = SUB81(uVar62 >> 0xf,0);
                        auVar134._60_4_ =
                             (uint)bVar9 * auVar119._60_4_ |
                             (uint)!bVar9 * *(int *)(local_890.ray + 0x23c);
                        *(undefined1 (*) [64])(local_890.ray + 0x200) = auVar134;
                        if ((short)uVar62 != 0) {
                          bVar61 = 1;
                          goto LAB_017d7aa2;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar127;
                      uVar62 = 0;
                      uVar67 = uVar67 ^ 1L << (uVar68 & 0x3f);
                      for (uVar68 = uVar67; (uVar68 & 1) == 0;
                          uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                        uVar62 = uVar62 + 1;
                      }
                    }
                    bVar61 = 0;
LAB_017d7aa2:
                    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar187 = ZEXT3264(auVar97);
                    auVar81 = vxorps_avx512vl(auVar81,auVar81);
                    auVar188 = ZEXT1664(auVar81);
                    auVar190 = ZEXT3264(local_700);
                    auVar189 = ZEXT3264(local_720);
                    auVar119 = ZEXT3264(local_860);
                    auVar191 = ZEXT3264(local_780);
                    auVar193 = ZEXT3264(local_7a0);
                    auVar192 = ZEXT3264(local_7c0);
                    auVar194 = ZEXT3264(local_7e0);
                    auVar195 = ZEXT3264(local_800);
                    auVar196 = ZEXT3264(local_6c0);
                    auVar197 = ZEXT3264(local_6e0);
                  }
                  bVar66 = (bool)(bVar66 | bVar61);
                }
              }
              goto LAB_017d7a89;
            }
          }
          auVar119 = ZEXT3264(local_860);
        }
LAB_017d7a89:
      }
    }
    if (bVar66) break;
    uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar31._4_4_ = uVar127;
    auVar31._0_4_ = uVar127;
    auVar31._8_4_ = uVar127;
    auVar31._12_4_ = uVar127;
    uVar29 = vcmpps_avx512vl(local_5b0,auVar31,2);
  }
  return uVar71 != 0;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }